

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

Matrix<double,_1,_197,_1,_1,_197> *
opengv::relative_pose::modules::fivept_kneip::initEpncpRowR
          (Matrix<double,_1,_197,_1,_1,_197> *__return_storage_ptr__,
          vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          *c123_1,vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                  *c123_2)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pointer pMVar11;
  pointer pMVar12;
  pointer pMVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  
  memset(__return_storage_ptr__,0,0x628);
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar547._8_8_ = 0;
  auVar547._0_8_ = dVar2;
  auVar291._8_8_ = 0;
  auVar291._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar778._8_8_ = 0;
  auVar778._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar423._8_8_ = 0;
  auVar423._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar663._8_8_ = 0;
  auVar663._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar663,auVar291,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar778,auVar291);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar423,auVar778);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar16,auVar547);
  auVar14 = vfmadd231sd_fma(auVar14,auVar16,auVar423);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar292._8_8_ = 0;
  auVar292._0_8_ = dVar2;
  auVar424._8_8_ = 0;
  auVar424._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar664._8_8_ = 0;
  auVar664._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar779._8_8_ = 0;
  auVar779._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar548._8_8_ = 0;
  auVar548._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar548,auVar424,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar664,auVar779);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar664,auVar292);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar18,auVar779);
  auVar14 = vfmadd231sd_fma(auVar14,auVar18,auVar424);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[1] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar549._8_8_ = 0;
  auVar549._0_8_ = dVar2;
  auVar293._8_8_ = 0;
  auVar293._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar780._8_8_ = 0;
  auVar780._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar425._8_8_ = 0;
  auVar425._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar665._8_8_ = 0;
  auVar665._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar665,auVar293,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar780,auVar293);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar425,auVar780);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar20,auVar549);
  auVar14 = vfmadd231sd_fma(auVar14,auVar20,auVar425);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[2] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar550._8_8_ = 0;
  auVar550._0_8_ = dVar2;
  auVar294._8_8_ = 0;
  auVar294._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar781._8_8_ = 0;
  auVar781._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar426._8_8_ = 0;
  auVar426._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar903._8_8_ = 0;
  auVar903._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar929._8_8_ = 0;
  auVar929._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar948._8_8_ = 0;
  auVar948._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar666._8_8_ = 0;
  auVar666._0_8_ = dVar2 * dVar1;
  auVar14 = vfnmsub231sd_fma(auVar666,auVar21,auVar294);
  auVar14 = vfmadd231sd_fma(auVar14,auVar21,auVar781);
  auVar14 = vfmadd231sd_fma(auVar14,auVar426,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar903,auVar929);
  auVar14 = vfmadd231sd_fma(auVar14,auVar903,auVar948);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar903,auVar781);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar903,auVar426);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar22,auVar929);
  auVar14 = vfmadd231sd_fma(auVar14,auVar22,auVar294);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar22,auVar948);
  auVar14 = vfmadd231sd_fma(auVar14,auVar22,auVar550);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[3] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar295._8_8_ = 0;
  auVar295._0_8_ = dVar2;
  auVar427._8_8_ = 0;
  auVar427._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar667._8_8_ = 0;
  auVar667._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar782._8_8_ = 0;
  auVar782._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar551,auVar427,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar667,auVar782);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar667,auVar295);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar24,auVar782);
  auVar14 = vfmadd231sd_fma(auVar14,auVar24,auVar427);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[4] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar552._8_8_ = 0;
  auVar552._0_8_ = dVar2;
  auVar296._8_8_ = 0;
  auVar296._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar783._8_8_ = 0;
  auVar783._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar428._8_8_ = 0;
  auVar428._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar668._8_8_ = 0;
  auVar668._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar668,auVar296,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar783,auVar296);
  auVar14 = vfmadd231sd_fma(auVar14,auVar428,auVar783);
  auVar14 = vfmadd231sd_fma(auVar14,auVar26,auVar552);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar26,auVar428);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[5] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar553._8_8_ = 0;
  auVar553._0_8_ = dVar2;
  auVar297._8_8_ = 0;
  auVar297._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar784._8_8_ = 0;
  auVar784._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar429._8_8_ = 0;
  auVar429._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar669._8_8_ = 0;
  auVar669._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar669,auVar297,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar784,auVar297);
  auVar14 = vfmadd231sd_fma(auVar14,auVar429,auVar784);
  auVar14 = vfmadd231sd_fma(auVar14,auVar28,auVar553);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar28,auVar429);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[6] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar554._8_8_ = 0;
  auVar554._0_8_ = dVar2;
  auVar298._8_8_ = 0;
  auVar298._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar785._8_8_ = 0;
  auVar785._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar430._8_8_ = 0;
  auVar430._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar670._8_8_ = 0;
  auVar670._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar670,auVar298,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar785,auVar298);
  auVar14 = vfmadd231sd_fma(auVar14,auVar430,auVar785);
  auVar14 = vfmadd231sd_fma(auVar14,auVar30,auVar554);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar30,auVar430);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[7] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar299._8_8_ = 0;
  auVar299._0_8_ = dVar2;
  auVar431._8_8_ = 0;
  auVar431._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar671._8_8_ = 0;
  auVar671._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar786._8_8_ = 0;
  auVar786._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar555._8_8_ = 0;
  auVar555._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar555,auVar431,auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar671,auVar786);
  auVar14 = vfmadd231sd_fma(auVar14,auVar671,auVar299);
  auVar14 = vfmadd231sd_fma(auVar14,auVar32,auVar786);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar32,auVar431);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[8] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar432._8_8_ = 0;
  auVar432._0_8_ = dVar2;
  auVar300._8_8_ = 0;
  auVar300._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar787._8_8_ = 0;
  auVar787._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar672._8_8_ = 0;
  auVar672._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar904._8_8_ = 0;
  auVar904._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar930._8_8_ = 0;
  auVar930._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar556._8_8_ = 0;
  auVar556._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar556,auVar33,auVar300);
  auVar14 = vfmadd231sd_fma(auVar14,auVar33,auVar787);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar672,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar904,auVar930);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar904,auVar432);
  auVar433._8_8_ = 0;
  auVar433._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar904,auVar787);
  auVar14 = vfmadd231sd_fma(auVar14,auVar433,auVar904);
  auVar14 = vfmadd231sd_fma(auVar14,auVar34,auVar300);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar34,auVar930);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar34,auVar433);
  auVar14 = vfmadd231sd_fma(auVar14,auVar34,auVar672);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[10] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar557._8_8_ = 0;
  auVar557._0_8_ = dVar2;
  auVar301._8_8_ = 0;
  auVar301._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar788._8_8_ = 0;
  auVar788._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar434._8_8_ = 0;
  auVar434._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar673._8_8_ = 0;
  auVar673._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar673,auVar301,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar788,auVar301);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar434,auVar788);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar36,auVar557);
  auVar14 = vfmadd231sd_fma(auVar14,auVar36,auVar434);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xb] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar302._8_8_ = 0;
  auVar302._0_8_ = dVar2;
  auVar435._8_8_ = 0;
  auVar435._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar674._8_8_ = 0;
  auVar674._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar789._8_8_ = 0;
  auVar789._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar558,auVar435,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar674,auVar789);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar674,auVar302);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar38,auVar789);
  auVar14 = vfmadd231sd_fma(auVar14,auVar38,auVar435);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xc] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar559._8_8_ = 0;
  auVar559._0_8_ = dVar2;
  auVar303._8_8_ = 0;
  auVar303._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar790._8_8_ = 0;
  auVar790._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar436._8_8_ = 0;
  auVar436._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar675._8_8_ = 0;
  auVar675._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar675,auVar303,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar790,auVar303);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar436,auVar790);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar40,auVar559);
  auVar14 = vfmadd231sd_fma(auVar14,auVar40,auVar436);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xd] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar304._8_8_ = 0;
  auVar304._0_8_ = dVar2;
  auVar437._8_8_ = 0;
  auVar437._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar676._8_8_ = 0;
  auVar676._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar791._8_8_ = 0;
  auVar791._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar560._8_8_ = 0;
  auVar560._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar560,auVar437,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar676,auVar791);
  auVar14 = vfmadd231sd_fma(auVar14,auVar676,auVar304);
  auVar14 = vfmadd231sd_fma(auVar14,auVar42,auVar791);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar42,auVar437);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xe] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar438._8_8_ = 0;
  auVar438._0_8_ = dVar2;
  auVar305._8_8_ = 0;
  auVar305._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar677._8_8_ = 0;
  auVar677._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar792._8_8_ = 0;
  auVar792._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar905._8_8_ = 0;
  auVar905._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar561._8_8_ = 0;
  auVar561._0_8_ = dVar1 * dVar2;
  auVar14 = vfmadd231sd_fma(auVar561,auVar43,auVar305);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar43,auVar677);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar792,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar905,auVar305);
  auVar306._8_8_ = 0;
  auVar306._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar905,auVar438);
  auVar439._8_8_ = 0;
  auVar439._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar14 = vfmadd231sd_fma(auVar14,auVar905,auVar439);
  auVar14 = vfmadd231sd_fma(auVar14,auVar306,auVar905);
  auVar14 = vfmadd231sd_fma(auVar14,auVar44,auVar677);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar44,auVar439);
  auVar14 = vfmadd231sd_fma(auVar14,auVar44,auVar792);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar44,auVar306);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0xf] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar307._8_8_ = 0;
  auVar307._0_8_ = dVar2;
  auVar440._8_8_ = 0;
  auVar440._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar678._8_8_ = 0;
  auVar678._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar793._8_8_ = 0;
  auVar793._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar562._8_8_ = 0;
  auVar562._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar562,auVar440,auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar678,auVar793);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar678,auVar307);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar46,auVar793);
  auVar14 = vfmadd231sd_fma(auVar14,auVar46,auVar440);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x10] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar563._8_8_ = 0;
  auVar563._0_8_ = dVar2;
  auVar308._8_8_ = 0;
  auVar308._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar794._8_8_ = 0;
  auVar794._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar441._8_8_ = 0;
  auVar441._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar679._8_8_ = 0;
  auVar679._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar679,auVar308,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar794,auVar308);
  auVar14 = vfmadd231sd_fma(auVar14,auVar441,auVar794);
  auVar14 = vfmadd231sd_fma(auVar14,auVar48,auVar563);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar48,auVar441);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x12] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar564._8_8_ = 0;
  auVar564._0_8_ = dVar2;
  auVar309._8_8_ = 0;
  auVar309._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar795._8_8_ = 0;
  auVar795._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar442._8_8_ = 0;
  auVar442._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar680._8_8_ = 0;
  auVar680._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar680,auVar309,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar795,auVar309);
  auVar14 = vfmadd231sd_fma(auVar14,auVar442,auVar795);
  auVar14 = vfmadd231sd_fma(auVar14,auVar50,auVar564);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar50,auVar442);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x13] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar443._8_8_ = 0;
  auVar443._0_8_ = dVar2;
  auVar310._8_8_ = 0;
  auVar310._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar681._8_8_ = 0;
  auVar681._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar796._8_8_ = 0;
  auVar796._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar906._8_8_ = 0;
  auVar906._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar565._8_8_ = 0;
  auVar565._0_8_ = dVar1 * dVar2;
  auVar14 = vfmadd231sd_fma(auVar565,auVar51,auVar310);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar51,auVar681);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar796,auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar906,auVar310);
  auVar311._8_8_ = 0;
  auVar311._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar906,auVar443);
  auVar444._8_8_ = 0;
  auVar444._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar14 = vfmadd231sd_fma(auVar14,auVar906,auVar444);
  auVar14 = vfmadd231sd_fma(auVar14,auVar311,auVar906);
  auVar14 = vfmadd231sd_fma(auVar14,auVar52,auVar681);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar52,auVar444);
  auVar14 = vfmadd231sd_fma(auVar14,auVar52,auVar796);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar52,auVar311);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x14] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar566._8_8_ = 0;
  auVar566._0_8_ = dVar2;
  auVar312._8_8_ = 0;
  auVar312._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar797._8_8_ = 0;
  auVar797._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar445._8_8_ = 0;
  auVar445._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar682._8_8_ = 0;
  auVar682._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar682,auVar312,auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar797,auVar312);
  auVar14 = vfmadd231sd_fma(auVar14,auVar445,auVar797);
  auVar14 = vfmadd231sd_fma(auVar14,auVar54,auVar566);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar54,auVar445);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x15] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar313._8_8_ = 0;
  auVar313._0_8_ = dVar2;
  auVar446._8_8_ = 0;
  auVar446._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar683._8_8_ = 0;
  auVar683._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar798._8_8_ = 0;
  auVar798._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar567,auVar446,auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar683,auVar798);
  auVar14 = vfmadd231sd_fma(auVar14,auVar683,auVar313);
  auVar14 = vfmadd231sd_fma(auVar14,auVar56,auVar798);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar56,auVar446);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x16] = auVar14._0_8_;
  dVar1 = pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar314._8_8_ = 0;
  auVar314._0_8_ = dVar2;
  auVar447._8_8_ = 0;
  auVar447._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar684._8_8_ = 0;
  auVar684._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar799._8_8_ = 0;
  auVar799._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar568,auVar447,auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar684,auVar799);
  auVar14 = vfmadd231sd_fma(auVar14,auVar684,auVar314);
  auVar14 = vfmadd231sd_fma(auVar14,auVar58,auVar799);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar58,auVar447);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x17] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar569._8_8_ = 0;
  auVar569._0_8_ = dVar2;
  auVar315._8_8_ = 0;
  auVar315._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar800._8_8_ = 0;
  auVar800._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar448._8_8_ = 0;
  auVar448._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar685._8_8_ = 0;
  auVar685._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar685,auVar315,auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar800,auVar315);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar448,auVar800);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar60,auVar569);
  auVar14 = vfmadd231sd_fma(auVar14,auVar60,auVar448);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x19] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar449._8_8_ = 0;
  auVar449._0_8_ = dVar2;
  auVar316._8_8_ = 0;
  auVar316._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar801._8_8_ = 0;
  auVar801._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar686._8_8_ = 0;
  auVar686._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar907._8_8_ = 0;
  auVar907._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar931._8_8_ = 0;
  auVar931._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar570._8_8_ = 0;
  auVar570._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar570,auVar61,auVar316);
  auVar14 = vfmadd231sd_fma(auVar14,auVar61,auVar801);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar686,auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar907,auVar931);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar907,auVar449);
  auVar450._8_8_ = 0;
  auVar450._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar907,auVar801);
  auVar14 = vfmadd231sd_fma(auVar14,auVar450,auVar907);
  auVar14 = vfmadd231sd_fma(auVar14,auVar62,auVar316);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar62,auVar931);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar62,auVar450);
  auVar14 = vfmadd231sd_fma(auVar14,auVar62,auVar686);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1a] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar317._8_8_ = 0;
  auVar317._0_8_ = dVar2;
  auVar451._8_8_ = 0;
  auVar451._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar687._8_8_ = 0;
  auVar687._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar802._8_8_ = 0;
  auVar802._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar571._8_8_ = 0;
  auVar571._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar571,auVar451,auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar687,auVar802);
  auVar14 = vfmadd231sd_fma(auVar14,auVar687,auVar317);
  auVar14 = vfmadd231sd_fma(auVar14,auVar64,auVar802);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar64,auVar451);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1b] = auVar14._0_8_;
  dVar1 = pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar318._8_8_ = 0;
  auVar318._0_8_ = dVar1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  pMVar12 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar13 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar452._8_8_ = 0;
  auVar452._0_8_ =
       dVar1 * *(double *)
                ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + 0x38);
  auVar14 = vfnmsub231sd_fma(auVar452,auVar318,auVar14);
  auVar572._8_8_ = 0;
  auVar572._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(double *)
                  ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar318,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar318,auVar4);
  auVar319._8_8_ = 0;
  auVar319._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x18);
  auVar14 = vfmadd231sd_fma(auVar14,auVar65,auVar5);
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar319,auVar572);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar319,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar319,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x18);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar66,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar66,auVar9);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar66,auVar572);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar14 = vfmadd231sd_fma(auVar14,auVar66,auVar10);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1c] = auVar14._0_8_;
  dVar1 = pMVar13[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar573._8_8_ = 0;
  auVar573._0_8_ = dVar2;
  auVar320._8_8_ = 0;
  auVar320._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar803._8_8_ = 0;
  auVar803._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar453._8_8_ = 0;
  auVar453._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar688._8_8_ = 0;
  auVar688._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar688,auVar320,auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar803,auVar320);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar453,auVar803);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar68,auVar573);
  auVar14 = vfmadd231sd_fma(auVar14,auVar68,auVar453);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1d] = auVar14._0_8_;
  dVar1 = pMVar13[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar321._8_8_ = 0;
  auVar321._0_8_ = dVar2;
  auVar454._8_8_ = 0;
  auVar454._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar689._8_8_ = 0;
  auVar689._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar804._8_8_ = 0;
  auVar804._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar574,auVar454,auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar689,auVar804);
  auVar14 = vfmadd231sd_fma(auVar14,auVar689,auVar321);
  auVar14 = vfmadd231sd_fma(auVar14,auVar70,auVar804);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar70,auVar454);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x1e] = auVar14._0_8_;
  dVar1 = pMVar13[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar322._8_8_ = 0;
  auVar322._0_8_ = dVar2;
  auVar455._8_8_ = 0;
  auVar455._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar690._8_8_ = 0;
  auVar690._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar805._8_8_ = 0;
  auVar805._0_8_ =
       *(ulong *)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar575,auVar455,auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar690,auVar805);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar690,auVar322);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar72,auVar805);
  auVar14 = vfmadd231sd_fma(auVar14,auVar72,auVar455);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x21] = auVar14._0_8_;
  dVar1 = pMVar13[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar323._8_8_ = 0;
  auVar323._0_8_ = dVar2;
  auVar456._8_8_ = 0;
  auVar456._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar691._8_8_ = 0;
  auVar691._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar806._8_8_ = 0;
  auVar806._0_8_ =
       *(ulong *)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar576,auVar456,auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       *(double *)
        ((long)&(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar691,auVar806);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar691,auVar323);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar74,auVar806);
  auVar14 = vfmadd231sd_fma(auVar14,auVar74,auVar456);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x22] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar324._8_8_ = 0;
  auVar324._0_8_ = dVar2;
  auVar457._8_8_ = 0;
  auVar457._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar692._8_8_ = 0;
  auVar692._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar807._8_8_ = 0;
  auVar807._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar577._8_8_ = 0;
  auVar577._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar577,auVar457,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar692,auVar807);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar692,auVar324);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar76,auVar807);
  auVar14 = vfmadd231sd_fma(auVar14,auVar76,auVar457);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x27] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar578._8_8_ = 0;
  auVar578._0_8_ = dVar2;
  auVar325._8_8_ = 0;
  auVar325._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar808._8_8_ = 0;
  auVar808._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar458._8_8_ = 0;
  auVar458._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar693._8_8_ = 0;
  auVar693._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar693,auVar325,auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar808,auVar325);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar458,auVar808);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar78,auVar578);
  auVar14 = vfmadd231sd_fma(auVar14,auVar78,auVar458);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x28] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar326._8_8_ = 0;
  auVar326._0_8_ = dVar2;
  auVar459._8_8_ = 0;
  auVar459._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar694._8_8_ = 0;
  auVar694._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar809._8_8_ = 0;
  auVar809._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar579._8_8_ = 0;
  auVar579._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar579,auVar459,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar694,auVar809);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar694,auVar326);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar80,auVar809);
  auVar14 = vfmadd231sd_fma(auVar14,auVar80,auVar459);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x29] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar460._8_8_ = 0;
  auVar460._0_8_ = dVar2;
  auVar327._8_8_ = 0;
  auVar327._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar695._8_8_ = 0;
  auVar695._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar908._8_8_ = 0;
  auVar908._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar932._8_8_ = 0;
  auVar932._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar810._8_8_ = 0;
  auVar810._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar580,auVar81,auVar327);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar81,auVar695);
  auVar14 = vfmadd231sd_fma(auVar14,auVar908,auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar932,auVar327);
  auVar328._8_8_ = 0;
  auVar328._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar932,auVar695);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar932,auVar328);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar810,auVar932);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar82,auVar460);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar82,auVar908);
  auVar14 = vfmadd231sd_fma(auVar14,auVar82,auVar328);
  auVar14 = vfmadd231sd_fma(auVar14,auVar82,auVar810);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2a] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar581._8_8_ = 0;
  auVar581._0_8_ = dVar2;
  auVar329._8_8_ = 0;
  auVar329._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar811._8_8_ = 0;
  auVar811._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar461._8_8_ = 0;
  auVar461._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar696._8_8_ = 0;
  auVar696._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar696,auVar329,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar811,auVar329);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar461,auVar811);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar84,auVar581);
  auVar14 = vfmadd231sd_fma(auVar14,auVar84,auVar461);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2b] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar582._8_8_ = 0;
  auVar582._0_8_ = dVar2;
  auVar330._8_8_ = 0;
  auVar330._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar462._8_8_ = 0;
  auVar462._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar812._8_8_ = 0;
  auVar812._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar697._8_8_ = 0;
  auVar697._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar697,auVar330,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar86,auVar330);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar462,auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar87,auVar330);
  auVar14 = vfmadd231sd_fma(auVar14,auVar582,auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar812,auVar330);
  auVar331._8_8_ = 0;
  auVar331._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar462,auVar812);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar331,auVar582);
  auVar14 = vfmadd231sd_fma(auVar14,auVar462,auVar331);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar88,auVar582);
  auVar14 = vfmadd231sd_fma(auVar14,auVar88,auVar462);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2c] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar583._8_8_ = 0;
  auVar583._0_8_ = dVar2;
  auVar332._8_8_ = 0;
  auVar332._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar463._8_8_ = 0;
  auVar463._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar813._8_8_ = 0;
  auVar813._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar698._8_8_ = 0;
  auVar698._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar698,auVar332,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar90,auVar332);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar463,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar91,auVar332);
  auVar14 = vfmadd231sd_fma(auVar14,auVar583,auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar813,auVar332);
  auVar333._8_8_ = 0;
  auVar333._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar463,auVar813);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar333,auVar583);
  auVar14 = vfmadd231sd_fma(auVar14,auVar463,auVar333);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar92,auVar583);
  auVar14 = vfmadd231sd_fma(auVar14,auVar92,auVar463);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2d] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar464._8_8_ = 0;
  auVar464._0_8_ = dVar2;
  auVar334._8_8_ = 0;
  auVar334._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar584._8_8_ = 0;
  auVar584._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar814._8_8_ = 0;
  auVar814._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar699._8_8_ = 0;
  auVar699._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar699,auVar334,auVar93);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar94,auVar334);
  auVar14 = vfmadd231sd_fma(auVar14,auVar584,auVar94);
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar95,auVar584);
  auVar14 = vfmadd231sd_fma(auVar14,auVar464,auVar95);
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar814,auVar584);
  auVar14 = vfmadd231sd_fma(auVar14,auVar464,auVar814);
  auVar815._8_8_ = 0;
  auVar815._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar815,auVar334);
  auVar14 = vfmadd231sd_fma(auVar14,auVar815,auVar584);
  auVar14 = vfmadd231sd_fma(auVar14,auVar96,auVar334);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar96,auVar464);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2e] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar585._8_8_ = 0;
  auVar585._0_8_ = dVar2;
  auVar335._8_8_ = 0;
  auVar335._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar465._8_8_ = 0;
  auVar465._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar816._8_8_ = 0;
  auVar816._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar700._8_8_ = 0;
  auVar700._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar700,auVar335,auVar97);
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar98,auVar335);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar585,auVar98);
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar99,auVar335);
  auVar14 = vfmadd231sd_fma(auVar14,auVar465,auVar99);
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar816,auVar585);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar465,auVar816);
  auVar817._8_8_ = 0;
  auVar817._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar817,auVar335);
  auVar14 = vfmadd231sd_fma(auVar14,auVar465,auVar817);
  auVar14 = vfmadd231sd_fma(auVar14,auVar100,auVar585);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar100,auVar465);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x2f] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar466._8_8_ = 0;
  auVar466._0_8_ = dVar2;
  auVar336._8_8_ = 0;
  auVar336._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar701._8_8_ = 0;
  auVar701._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar909._8_8_ = 0;
  auVar909._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar933._8_8_ = 0;
  auVar933._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar818._8_8_ = 0;
  auVar818._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar586._8_8_ = 0;
  auVar586._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar586,auVar336,auVar101);
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar102,auVar701);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar909,auVar102);
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar103,auVar701);
  auVar702._8_8_ = 0;
  auVar702._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar702,auVar103);
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar933,auVar336);
  auVar337._8_8_ = 0;
  auVar337._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar818,auVar933);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar337,auVar466);
  auVar14 = vfmadd231sd_fma(auVar14,auVar337,auVar818);
  auVar14 = vfmadd231sd_fma(auVar14,auVar104,auVar909);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar104,auVar702);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x30] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar2;
  auVar467._8_8_ = 0;
  auVar467._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar703._8_8_ = 0;
  auVar703._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar819._8_8_ = 0;
  auVar819._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar587._8_8_ = 0;
  auVar587._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar587,auVar467,auVar105);
  auVar106._8_8_ = 0;
  auVar106._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar703,auVar819);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar703,auVar338);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar106,auVar819);
  auVar14 = vfmadd231sd_fma(auVar14,auVar106,auVar467);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x31] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar588._8_8_ = 0;
  auVar588._0_8_ = dVar2;
  auVar339._8_8_ = 0;
  auVar339._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar820._8_8_ = 0;
  auVar820._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar468._8_8_ = 0;
  auVar468._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar704._8_8_ = 0;
  auVar704._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar704,auVar339,auVar107);
  auVar108._8_8_ = 0;
  auVar108._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar820,auVar339);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar468,auVar820);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar108,auVar588);
  auVar14 = vfmadd231sd_fma(auVar14,auVar108,auVar468);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x32] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar469._8_8_ = 0;
  auVar469._0_8_ = dVar2;
  auVar340._8_8_ = 0;
  auVar340._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar589._8_8_ = 0;
  auVar589._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar821._8_8_ = 0;
  auVar821._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar705._8_8_ = 0;
  auVar705._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar705,auVar340,auVar109);
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar110,auVar340);
  auVar14 = vfmadd231sd_fma(auVar14,auVar589,auVar110);
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar111,auVar589);
  auVar14 = vfmadd231sd_fma(auVar14,auVar469,auVar111);
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar821,auVar589);
  auVar14 = vfmadd231sd_fma(auVar14,auVar469,auVar821);
  auVar822._8_8_ = 0;
  auVar822._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar822,auVar340);
  auVar14 = vfmadd231sd_fma(auVar14,auVar822,auVar589);
  auVar14 = vfmadd231sd_fma(auVar14,auVar112,auVar340);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar112,auVar469);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x33] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar590._8_8_ = 0;
  auVar590._0_8_ = dVar2;
  auVar341._8_8_ = 0;
  auVar341._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar823._8_8_ = 0;
  auVar823._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar910._8_8_ = 0;
  auVar910._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar470._8_8_ = 0;
  auVar470._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar706._8_8_ = 0;
  auVar706._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar706,auVar341,auVar113);
  auVar114._8_8_ = 0;
  auVar114._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar114,auVar823);
  auVar14 = vfmadd231sd_fma(auVar14,auVar910,auVar114);
  auVar115._8_8_ = 0;
  auVar115._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar115,auVar910);
  auVar911._8_8_ = 0;
  auVar911._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar14 = vfmadd231sd_fma(auVar14,auVar470,auVar115);
  auVar116._8_8_ = 0;
  auVar116._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar911,auVar590);
  auVar591._8_8_ = 0;
  auVar591._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar591,auVar911);
  auVar912._8_8_ = 0;
  auVar912._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar912,auVar341);
  auVar14 = vfmadd231sd_fma(auVar14,auVar912,auVar591);
  auVar14 = vfmadd231sd_fma(auVar14,auVar116,auVar823);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar116,auVar470);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x34] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar592._8_8_ = 0;
  auVar592._0_8_ = dVar2;
  auVar342._8_8_ = 0;
  auVar342._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar471._8_8_ = 0;
  auVar471._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar824._8_8_ = 0;
  auVar824._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar707._8_8_ = 0;
  auVar707._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar707,auVar342,auVar117);
  auVar118._8_8_ = 0;
  auVar118._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar118,auVar342);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar592,auVar118);
  auVar119._8_8_ = 0;
  auVar119._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar119,auVar342);
  auVar14 = vfmadd231sd_fma(auVar14,auVar471,auVar119);
  auVar120._8_8_ = 0;
  auVar120._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar824,auVar592);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar471,auVar824);
  auVar825._8_8_ = 0;
  auVar825._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar825,auVar342);
  auVar14 = vfmadd231sd_fma(auVar14,auVar471,auVar825);
  auVar14 = vfmadd231sd_fma(auVar14,auVar120,auVar592);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar120,auVar471);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x35] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar2;
  auVar472._8_8_ = 0;
  auVar472._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar708._8_8_ = 0;
  auVar708._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar826._8_8_ = 0;
  auVar826._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar593._8_8_ = 0;
  auVar593._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar593,auVar472,auVar121);
  auVar122._8_8_ = 0;
  auVar122._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar708,auVar826);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar708,auVar343);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar122,auVar826);
  auVar14 = vfmadd231sd_fma(auVar14,auVar122,auVar472);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x36] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar473._8_8_ = 0;
  auVar473._0_8_ = dVar2;
  auVar344._8_8_ = 0;
  auVar344._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar709._8_8_ = 0;
  auVar709._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar913._8_8_ = 0;
  auVar913._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar934._8_8_ = 0;
  auVar934._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar827._8_8_ = 0;
  auVar827._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar594._8_8_ = 0;
  auVar594._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar594,auVar123,auVar344);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar123,auVar709);
  auVar14 = vfmadd231sd_fma(auVar14,auVar913,auVar123);
  auVar124._8_8_ = 0;
  auVar124._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar934,auVar344);
  auVar345._8_8_ = 0;
  auVar345._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar934,auVar709);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar934,auVar345);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar827,auVar934);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar124,auVar473);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar124,auVar913);
  auVar14 = vfmadd231sd_fma(auVar14,auVar124,auVar345);
  auVar14 = vfmadd231sd_fma(auVar14,auVar124,auVar827);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x37] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar595._8_8_ = 0;
  auVar595._0_8_ = dVar2;
  auVar346._8_8_ = 0;
  auVar346._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar828._8_8_ = 0;
  auVar828._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar474._8_8_ = 0;
  auVar474._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar710._8_8_ = 0;
  auVar710._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar710,auVar346,auVar125);
  auVar126._8_8_ = 0;
  auVar126._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar828,auVar346);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar474,auVar828);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar126,auVar595);
  auVar14 = vfmadd231sd_fma(auVar14,auVar126,auVar474);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x38] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar596._8_8_ = 0;
  auVar596._0_8_ = dVar2;
  auVar347._8_8_ = 0;
  auVar347._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar829._8_8_ = 0;
  auVar829._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar475._8_8_ = 0;
  auVar475._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar711._8_8_ = 0;
  auVar711._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar711,auVar347,auVar127);
  auVar128._8_8_ = 0;
  auVar128._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar829,auVar347);
  auVar14 = vfmadd231sd_fma(auVar14,auVar475,auVar829);
  auVar14 = vfmadd231sd_fma(auVar14,auVar128,auVar596);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar128,auVar475);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x39] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar597._8_8_ = 0;
  auVar597._0_8_ = dVar2;
  auVar348._8_8_ = 0;
  auVar348._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar830._8_8_ = 0;
  auVar830._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar476._8_8_ = 0;
  auVar476._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar712._8_8_ = 0;
  auVar712._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar712,auVar348,auVar129);
  auVar130._8_8_ = 0;
  auVar130._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar830,auVar348);
  auVar14 = vfmadd231sd_fma(auVar14,auVar476,auVar830);
  auVar14 = vfmadd231sd_fma(auVar14,auVar130,auVar597);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar130,auVar476);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3a] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar349._8_8_ = 0;
  auVar349._0_8_ = dVar2;
  auVar477._8_8_ = 0;
  auVar477._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar713._8_8_ = 0;
  auVar713._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar831._8_8_ = 0;
  auVar831._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar598._8_8_ = 0;
  auVar598._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar598,auVar477,auVar131);
  auVar132._8_8_ = 0;
  auVar132._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar713,auVar831);
  auVar14 = vfmadd231sd_fma(auVar14,auVar713,auVar349);
  auVar14 = vfmadd231sd_fma(auVar14,auVar132,auVar831);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar132,auVar477);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3b] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar350._8_8_ = 0;
  auVar350._0_8_ = dVar2;
  auVar478._8_8_ = 0;
  auVar478._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar714._8_8_ = 0;
  auVar714._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar832._8_8_ = 0;
  auVar832._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar599._8_8_ = 0;
  auVar599._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar599,auVar478,auVar133);
  auVar134._8_8_ = 0;
  auVar134._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar714,auVar832);
  auVar14 = vfmadd231sd_fma(auVar14,auVar714,auVar350);
  auVar14 = vfmadd231sd_fma(auVar14,auVar134,auVar832);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar134,auVar478);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3c] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar2;
  auVar479._8_8_ = 0;
  auVar479._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar715._8_8_ = 0;
  auVar715._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar833._8_8_ = 0;
  auVar833._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar600._8_8_ = 0;
  auVar600._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar600,auVar479,auVar135);
  auVar136._8_8_ = 0;
  auVar136._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar715,auVar833);
  auVar14 = vfmadd231sd_fma(auVar14,auVar715,auVar351);
  auVar14 = vfmadd231sd_fma(auVar14,auVar136,auVar833);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar136,auVar479);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3d] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar601._8_8_ = 0;
  auVar601._0_8_ = dVar2;
  auVar352._8_8_ = 0;
  auVar352._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar834._8_8_ = 0;
  auVar834._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar480._8_8_ = 0;
  auVar480._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar716._8_8_ = 0;
  auVar716._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar716,auVar352,auVar137);
  auVar138._8_8_ = 0;
  auVar138._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar834,auVar352);
  auVar14 = vfmadd231sd_fma(auVar14,auVar480,auVar834);
  auVar14 = vfmadd231sd_fma(auVar14,auVar138,auVar601);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar138,auVar480);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x3e] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar481._8_8_ = 0;
  auVar481._0_8_ = dVar2;
  auVar353._8_8_ = 0;
  auVar353._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar717._8_8_ = 0;
  auVar717._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar835._8_8_ = 0;
  auVar835._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar935._8_8_ = 0;
  auVar935._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar914._8_8_ = 0;
  auVar914._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar602._8_8_ = 0;
  auVar602._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar602,auVar139,auVar353);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar139,auVar717);
  auVar14 = vfmadd231sd_fma(auVar14,auVar835,auVar139);
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar935,auVar481);
  auVar482._8_8_ = 0;
  auVar482._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar935,auVar482);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar935,auVar914);
  auVar14 = vfmadd231sd_fma(auVar14,auVar935,auVar717);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar140,auVar353);
  auVar14 = vfmadd231sd_fma(auVar14,auVar140,auVar482);
  auVar14 = vfmadd231sd_fma(auVar14,auVar140,auVar914);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar140,auVar835);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x40] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar354._8_8_ = 0;
  auVar354._0_8_ = dVar2;
  auVar483._8_8_ = 0;
  auVar483._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar718._8_8_ = 0;
  auVar718._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar836._8_8_ = 0;
  auVar836._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar603._8_8_ = 0;
  auVar603._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar603,auVar483,auVar141);
  auVar142._8_8_ = 0;
  auVar142._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar718,auVar836);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar718,auVar354);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar142,auVar836);
  auVar14 = vfmadd231sd_fma(auVar14,auVar142,auVar483);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x41] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar604._8_8_ = 0;
  auVar604._0_8_ = dVar2;
  auVar355._8_8_ = 0;
  auVar355._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar837._8_8_ = 0;
  auVar837._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar484._8_8_ = 0;
  auVar484._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar719._8_8_ = 0;
  auVar719._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar719,auVar355,auVar143);
  auVar144._8_8_ = 0;
  auVar144._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfmadd231sd_fma(auVar14,auVar837,auVar355);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar484,auVar837);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar144,auVar604);
  auVar14 = vfmadd231sd_fma(auVar14,auVar144,auVar484);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x42] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar356._8_8_ = 0;
  auVar356._0_8_ = dVar2;
  auVar485._8_8_ = 0;
  auVar485._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar720._8_8_ = 0;
  auVar720._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar838._8_8_ = 0;
  auVar838._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar605._8_8_ = 0;
  auVar605._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar605,auVar485,auVar145);
  auVar146._8_8_ = 0;
  auVar146._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar146,auVar485);
  auVar14 = vfmadd231sd_fma(auVar14,auVar356,auVar146);
  auVar147._8_8_ = 0;
  auVar147._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar147,auVar720);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar356,auVar147);
  auVar148._8_8_ = 0;
  auVar148._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar838,auVar720);
  auVar14 = vfmadd231sd_fma(auVar14,auVar485,auVar838);
  auVar839._8_8_ = 0;
  auVar839._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar839,auVar720);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar839,auVar356);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar148,auVar720);
  auVar14 = vfmadd231sd_fma(auVar14,auVar148,auVar485);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x43] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar486._8_8_ = 0;
  auVar486._0_8_ = dVar2;
  auVar357._8_8_ = 0;
  auVar357._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar606._8_8_ = 0;
  auVar606._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar840._8_8_ = 0;
  auVar840._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar721._8_8_ = 0;
  auVar721._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar721,auVar357,auVar149);
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar150,auVar606);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar486,auVar150);
  auVar151._8_8_ = 0;
  auVar151._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar151,auVar357);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar606,auVar151);
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar840,auVar357);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar606,auVar840);
  auVar841._8_8_ = 0;
  auVar841._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar841,auVar606);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar486,auVar841);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar152,auVar357);
  auVar14 = vfmadd231sd_fma(auVar14,auVar152,auVar486);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x44] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar487._8_8_ = 0;
  auVar487._0_8_ = dVar2;
  auVar358._8_8_ = 0;
  auVar358._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar722._8_8_ = 0;
  auVar722._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar842._8_8_ = 0;
  auVar842._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar936._8_8_ = 0;
  auVar936._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar915._8_8_ = 0;
  auVar915._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar607._8_8_ = 0;
  auVar607._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar607,auVar358,auVar153);
  auVar154._8_8_ = 0;
  auVar154._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar154,auVar722);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar842,auVar154);
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar155,auVar722);
  auVar723._8_8_ = 0;
  auVar723._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar723,auVar155);
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar936,auVar358);
  auVar359._8_8_ = 0;
  auVar359._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar915,auVar936);
  auVar14 = vfmadd231sd_fma(auVar14,auVar359,auVar915);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar359,auVar487);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar156,auVar723);
  auVar14 = vfmadd231sd_fma(auVar14,auVar156,auVar842);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x45] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar2;
  auVar488._8_8_ = 0;
  auVar488._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar724._8_8_ = 0;
  auVar724._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar843._8_8_ = 0;
  auVar843._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar608._8_8_ = 0;
  auVar608._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar608,auVar488,auVar157);
  auVar158._8_8_ = 0;
  auVar158._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar724,auVar843);
  auVar14 = vfmadd231sd_fma(auVar14,auVar724,auVar360);
  auVar14 = vfmadd231sd_fma(auVar14,auVar158,auVar843);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar158,auVar488);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x46] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar361._8_8_ = 0;
  auVar361._0_8_ = dVar2;
  auVar489._8_8_ = 0;
  auVar489._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar725._8_8_ = 0;
  auVar725._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar844._8_8_ = 0;
  auVar844._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar609._8_8_ = 0;
  auVar609._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar609,auVar489,auVar159);
  auVar160._8_8_ = 0;
  auVar160._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar160,auVar725);
  auVar14 = vfmadd231sd_fma(auVar14,auVar361,auVar160);
  auVar161._8_8_ = 0;
  auVar161._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar161,auVar489);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar361,auVar161);
  auVar162._8_8_ = 0;
  auVar162._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar844,auVar725);
  auVar14 = vfmadd231sd_fma(auVar14,auVar844,auVar361);
  auVar362._8_8_ = 0;
  auVar362._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar362,auVar725);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar489,auVar362);
  auVar14 = vfmadd231sd_fma(auVar14,auVar162,auVar725);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar162,auVar489);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x47] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar610._8_8_ = 0;
  auVar610._0_8_ = dVar2;
  auVar363._8_8_ = 0;
  auVar363._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar490._8_8_ = 0;
  auVar490._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar845._8_8_ = 0;
  auVar845._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar726._8_8_ = 0;
  auVar726._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar726,auVar363,auVar163);
  auVar164._8_8_ = 0;
  auVar164._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar164,auVar363);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar490,auVar164);
  auVar165._8_8_ = 0;
  auVar165._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar165,auVar363);
  auVar14 = vfmadd231sd_fma(auVar14,auVar610,auVar165);
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar845,auVar363);
  auVar364._8_8_ = 0;
  auVar364._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar490,auVar845);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar364,auVar610);
  auVar14 = vfmadd231sd_fma(auVar14,auVar490,auVar364);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar166,auVar610);
  auVar14 = vfmadd231sd_fma(auVar14,auVar166,auVar490);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x49] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar611._8_8_ = 0;
  auVar611._0_8_ = dVar2;
  auVar365._8_8_ = 0;
  auVar365._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar846._8_8_ = 0;
  auVar846._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar491._8_8_ = 0;
  auVar491._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar727._8_8_ = 0;
  auVar727._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar727,auVar365,auVar167);
  auVar168._8_8_ = 0;
  auVar168._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar846,auVar365);
  auVar14 = vfmadd231sd_fma(auVar14,auVar491,auVar846);
  auVar14 = vfmadd231sd_fma(auVar14,auVar168,auVar611);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar168,auVar491);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4a] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x28);
  auVar492._8_8_ = 0;
  auVar492._0_8_ = dVar2;
  auVar366._8_8_ = 0;
  auVar366._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar847._8_8_ = 0;
  auVar847._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar916._8_8_ = 0;
  auVar916._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar612._8_8_ = 0;
  auVar612._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar937._8_8_ = 0;
  auVar937._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar728._8_8_ = 0;
  auVar728._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar728,auVar366,auVar169);
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar170,auVar847);
  auVar14 = vfmadd231sd_fma(auVar14,auVar916,auVar170);
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar171,auVar612);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar171,auVar916);
  auVar917._8_8_ = 0;
  auVar917._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar172._8_8_ = 0;
  auVar172._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar917,auVar937);
  auVar14 = vfmadd231sd_fma(auVar14,auVar917,auVar492);
  auVar493._8_8_ = 0;
  auVar493._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar493,auVar366);
  auVar14 = vfmadd231sd_fma(auVar14,auVar493,auVar937);
  auVar14 = vfmadd231sd_fma(auVar14,auVar172,auVar847);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar172,auVar612);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4c] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar494._8_8_ = 0;
  auVar494._0_8_ = dVar2;
  auVar367._8_8_ = 0;
  auVar367._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar613._8_8_ = 0;
  auVar613._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar848._8_8_ = 0;
  auVar848._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar729._8_8_ = 0;
  auVar729._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar729,auVar367,auVar173);
  auVar174._8_8_ = 0;
  auVar174._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar174,auVar367);
  auVar14 = vfmadd231sd_fma(auVar14,auVar613,auVar174);
  auVar175._8_8_ = 0;
  auVar175._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar175,auVar613);
  auVar14 = vfmadd231sd_fma(auVar14,auVar494,auVar175);
  auVar176._8_8_ = 0;
  auVar176._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar848,auVar613);
  auVar14 = vfmadd231sd_fma(auVar14,auVar494,auVar848);
  auVar849._8_8_ = 0;
  auVar849._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar849,auVar367);
  auVar14 = vfmadd231sd_fma(auVar14,auVar849,auVar613);
  auVar14 = vfmadd231sd_fma(auVar14,auVar176,auVar367);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar176,auVar494);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4d] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar614._8_8_ = 0;
  auVar614._0_8_ = dVar2;
  auVar368._8_8_ = 0;
  auVar368._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar495._8_8_ = 0;
  auVar495._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar850._8_8_ = 0;
  auVar850._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar730._8_8_ = 0;
  auVar730._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar730,auVar368,auVar177);
  auVar178._8_8_ = 0;
  auVar178._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar178,auVar368);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar614,auVar178);
  auVar179._8_8_ = 0;
  auVar179._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar179,auVar368);
  auVar14 = vfmadd231sd_fma(auVar14,auVar495,auVar179);
  auVar180._8_8_ = 0;
  auVar180._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar850,auVar614);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar495,auVar850);
  auVar851._8_8_ = 0;
  auVar851._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar851,auVar368);
  auVar14 = vfmadd231sd_fma(auVar14,auVar495,auVar851);
  auVar14 = vfmadd231sd_fma(auVar14,auVar180,auVar614);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar180,auVar495);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4e] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar496._8_8_ = 0;
  auVar496._0_8_ = dVar2;
  auVar369._8_8_ = 0;
  auVar369._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar731._8_8_ = 0;
  auVar731._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar852._8_8_ = 0;
  auVar852._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar938._8_8_ = 0;
  auVar938._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar918._8_8_ = 0;
  auVar918._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar615._8_8_ = 0;
  auVar615._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar615,auVar181,auVar369);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar181,auVar731);
  auVar14 = vfmadd231sd_fma(auVar14,auVar852,auVar181);
  auVar182._8_8_ = 0;
  auVar182._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar938,auVar496);
  auVar497._8_8_ = 0;
  auVar497._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar938,auVar497);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar938,auVar918);
  auVar14 = vfmadd231sd_fma(auVar14,auVar938,auVar731);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar182,auVar369);
  auVar14 = vfmadd231sd_fma(auVar14,auVar182,auVar497);
  auVar14 = vfmadd231sd_fma(auVar14,auVar182,auVar918);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar182,auVar852);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x4f] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar370._8_8_ = 0;
  auVar370._0_8_ = dVar2;
  auVar498._8_8_ = 0;
  auVar498._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar732._8_8_ = 0;
  auVar732._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar853._8_8_ = 0;
  auVar853._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar616._8_8_ = 0;
  auVar616._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar616,auVar498,auVar183);
  auVar184._8_8_ = 0;
  auVar184._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar732,auVar853);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar732,auVar370);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar184,auVar853);
  auVar14 = vfmadd231sd_fma(auVar14,auVar184,auVar498);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x50] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = dVar1;
  dVar2 = pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0];
  auVar617._8_8_ = 0;
  auVar617._0_8_ = dVar2;
  auVar499._8_8_ = 0;
  auVar499._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar854._8_8_ = 0;
  auVar854._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar371._8_8_ = 0;
  auVar371._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar733._8_8_ = 0;
  auVar733._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar733,auVar499,auVar185);
  auVar186._8_8_ = 0;
  auVar186._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar854,auVar617);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar371,auVar854);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar186,auVar499);
  auVar14 = vfmadd231sd_fma(auVar14,auVar186,auVar371);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x51] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar618._8_8_ = 0;
  auVar618._0_8_ = dVar2;
  auVar372._8_8_ = 0;
  auVar372._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar855._8_8_ = 0;
  auVar855._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar500._8_8_ = 0;
  auVar500._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar734._8_8_ = 0;
  auVar734._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar734,auVar372,auVar187);
  auVar188._8_8_ = 0;
  auVar188._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar855,auVar372);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar500,auVar855);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar188,auVar618);
  auVar14 = vfmadd231sd_fma(auVar14,auVar188,auVar500);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x52] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar373._8_8_ = 0;
  auVar373._0_8_ = dVar2;
  auVar501._8_8_ = 0;
  auVar501._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar735._8_8_ = 0;
  auVar735._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar856._8_8_ = 0;
  auVar856._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar619._8_8_ = 0;
  auVar619._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar619,auVar501,auVar189);
  auVar190._8_8_ = 0;
  auVar190._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar735,auVar856);
  auVar14 = vfmadd231sd_fma(auVar14,auVar735,auVar373);
  auVar14 = vfmadd231sd_fma(auVar14,auVar190,auVar856);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar190,auVar501);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x53] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar502._8_8_ = 0;
  auVar502._0_8_ = dVar2;
  auVar374._8_8_ = 0;
  auVar374._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar736._8_8_ = 0;
  auVar736._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar857._8_8_ = 0;
  auVar857._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar919._8_8_ = 0;
  auVar919._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar620._8_8_ = 0;
  auVar620._0_8_ = dVar1 * dVar2;
  auVar14 = vfmadd231sd_fma(auVar620,auVar191,auVar374);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar191,auVar736);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar857,auVar191);
  auVar192._8_8_ = 0;
  auVar192._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar919,auVar374);
  auVar375._8_8_ = 0;
  auVar375._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar919,auVar502);
  auVar503._8_8_ = 0;
  auVar503._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar14 = vfmadd231sd_fma(auVar14,auVar919,auVar503);
  auVar14 = vfmadd231sd_fma(auVar14,auVar375,auVar919);
  auVar14 = vfmadd231sd_fma(auVar14,auVar192,auVar736);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar192,auVar503);
  auVar14 = vfmadd231sd_fma(auVar14,auVar192,auVar857);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar192,auVar375);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x54] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x40);
  auVar376._8_8_ = 0;
  auVar376._0_8_ = dVar2;
  auVar504._8_8_ = 0;
  auVar504._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar737._8_8_ = 0;
  auVar737._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar858._8_8_ = 0;
  auVar858._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar621._8_8_ = 0;
  auVar621._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar621,auVar504,auVar193);
  auVar194._8_8_ = 0;
  auVar194._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar737,auVar858);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar737,auVar376);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar194,auVar858);
  auVar14 = vfmadd231sd_fma(auVar14,auVar194,auVar504);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x55] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar622._8_8_ = 0;
  auVar622._0_8_ = dVar2;
  auVar377._8_8_ = 0;
  auVar377._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar859._8_8_ = 0;
  auVar859._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar505._8_8_ = 0;
  auVar505._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar738._8_8_ = 0;
  auVar738._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar738,auVar377,auVar195);
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar859,auVar377);
  auVar14 = vfmadd231sd_fma(auVar14,auVar505,auVar859);
  auVar14 = vfmadd231sd_fma(auVar14,auVar196,auVar622);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar196,auVar505);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x56] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar623._8_8_ = 0;
  auVar623._0_8_ = dVar2;
  auVar378._8_8_ = 0;
  auVar378._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar860._8_8_ = 0;
  auVar860._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar506._8_8_ = 0;
  auVar506._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar920._8_8_ = 0;
  auVar920._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar939._8_8_ = 0;
  auVar939._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar949._8_8_ = 0;
  auVar949._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar739._8_8_ = 0;
  auVar739._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar739,auVar197,auVar378);
  auVar14 = vfmadd231sd_fma(auVar14,auVar197,auVar860);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar506,auVar197);
  auVar198._8_8_ = 0;
  auVar198._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar920,auVar939);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar920,auVar949);
  auVar14 = vfmadd231sd_fma(auVar14,auVar920,auVar623);
  auVar14 = vfmadd231sd_fma(auVar14,auVar920,auVar506);
  auVar14 = vfmadd231sd_fma(auVar14,auVar198,auVar939);
  auVar14 = vfmadd231sd_fma(auVar14,auVar198,auVar949);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar198,auVar378);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar198,auVar860);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x57] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x28);
  auVar379._8_8_ = 0;
  auVar379._0_8_ = dVar2;
  auVar507._8_8_ = 0;
  auVar507._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar740._8_8_ = 0;
  auVar740._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar861._8_8_ = 0;
  auVar861._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar624._8_8_ = 0;
  auVar624._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar624,auVar507,auVar199);
  auVar200._8_8_ = 0;
  auVar200._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar740,auVar861);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar740,auVar379);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar200,auVar861);
  auVar14 = vfmadd231sd_fma(auVar14,auVar200,auVar507);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x59] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar625._8_8_ = 0;
  auVar625._0_8_ = dVar2;
  auVar380._8_8_ = 0;
  auVar380._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar862._8_8_ = 0;
  auVar862._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar508._8_8_ = 0;
  auVar508._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar741._8_8_ = 0;
  auVar741._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar741,auVar380,auVar201);
  auVar202._8_8_ = 0;
  auVar202._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar862,auVar380);
  auVar14 = vfmadd231sd_fma(auVar14,auVar508,auVar862);
  auVar14 = vfmadd231sd_fma(auVar14,auVar202,auVar625);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar202,auVar508);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x5b] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar626._8_8_ = 0;
  auVar626._0_8_ = dVar2;
  auVar381._8_8_ = 0;
  auVar381._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x20);
  auVar863._8_8_ = 0;
  auVar863._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar509._8_8_ = 0;
  auVar509._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar742._8_8_ = 0;
  auVar742._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar742,auVar381,auVar203);
  auVar204._8_8_ = 0;
  auVar204._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar863,auVar381);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar509,auVar863);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar204,auVar626);
  auVar14 = vfmadd231sd_fma(auVar14,auVar204,auVar509);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x5c] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar2;
  auVar510._8_8_ = 0;
  auVar510._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar743._8_8_ = 0;
  auVar743._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar864._8_8_ = 0;
  auVar864._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar627._8_8_ = 0;
  auVar627._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar627,auVar510,auVar205);
  auVar206._8_8_ = 0;
  auVar206._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar743,auVar864);
  auVar14 = vfmadd231sd_fma(auVar14,auVar743,auVar382);
  auVar14 = vfmadd231sd_fma(auVar14,auVar206,auVar864);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar206,auVar510);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x5e] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar383._8_8_ = 0;
  auVar383._0_8_ = dVar2;
  auVar511._8_8_ = 0;
  auVar511._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar744._8_8_ = 0;
  auVar744._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar865._8_8_ = 0;
  auVar865._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar628._8_8_ = 0;
  auVar628._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar628,auVar511,auVar207);
  auVar208._8_8_ = 0;
  auVar208._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar744,auVar865);
  auVar14 = vfmadd231sd_fma(auVar14,auVar744,auVar383);
  auVar14 = vfmadd231sd_fma(auVar14,auVar208,auVar865);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar208,auVar511);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x61] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar629._8_8_ = 0;
  auVar629._0_8_ = dVar2;
  auVar384._8_8_ = 0;
  auVar384._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar866._8_8_ = 0;
  auVar866._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar512._8_8_ = 0;
  auVar512._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar921._8_8_ = 0;
  auVar921._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar940._8_8_ = 0;
  auVar940._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar950._8_8_ = 0;
  auVar950._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar745._8_8_ = 0;
  auVar745._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar745,auVar209,auVar384);
  auVar14 = vfmadd231sd_fma(auVar14,auVar209,auVar866);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar512,auVar209);
  auVar210._8_8_ = 0;
  auVar210._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar921,auVar940);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar921,auVar950);
  auVar14 = vfmadd231sd_fma(auVar14,auVar921,auVar629);
  auVar14 = vfmadd231sd_fma(auVar14,auVar921,auVar512);
  auVar14 = vfmadd231sd_fma(auVar14,auVar210,auVar940);
  auVar14 = vfmadd231sd_fma(auVar14,auVar210,auVar950);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar210,auVar384);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar210,auVar866);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x62] = auVar14._0_8_;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar385._8_8_ = 0;
  auVar385._0_8_ = dVar1;
  auVar513._8_8_ = 0;
  auVar513._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar867._8_8_ = 0;
  auVar867._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = dVar2;
  auVar746._8_8_ = 0;
  auVar746._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar630._8_8_ = 0;
  auVar630._0_8_ = dVar1 * dVar2;
  auVar14 = vfmsub231sd_fma(auVar630,auVar513,auVar211);
  auVar212._8_8_ = 0;
  auVar212._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar746,auVar867);
  auVar14 = vfmadd231sd_fma(auVar14,auVar746,auVar385);
  auVar14 = vfmadd231sd_fma(auVar14,auVar212,auVar867);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar212,auVar513);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[99] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = dVar1;
  auVar868._8_8_ = 0;
  auVar868._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar631._8_8_ = 0;
  auVar631._0_8_ = dVar2;
  auVar386._8_8_ = 0;
  auVar386._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar514._8_8_ = 0;
  auVar514._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar747._8_8_ = 0;
  auVar747._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar747,auVar386,auVar213);
  auVar214._8_8_ = 0;
  auVar214._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar868,auVar386);
  auVar14 = vfmadd231sd_fma(auVar14,auVar514,auVar868);
  auVar14 = vfmadd231sd_fma(auVar14,auVar214,auVar631);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar214,auVar514);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[100] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar632._8_8_ = 0;
  auVar632._0_8_ = dVar2;
  auVar387._8_8_ = 0;
  auVar387._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar869._8_8_ = 0;
  auVar869._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar515._8_8_ = 0;
  auVar515._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar748._8_8_ = 0;
  auVar748._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar748,auVar387,auVar215);
  auVar216._8_8_ = 0;
  auVar216._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar869,auVar387);
  auVar14 = vfmadd231sd_fma(auVar14,auVar515,auVar869);
  auVar14 = vfmadd231sd_fma(auVar14,auVar216,auVar632);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar216,auVar515);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x65] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar388._8_8_ = 0;
  auVar388._0_8_ = dVar2;
  auVar516._8_8_ = 0;
  auVar516._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar749._8_8_ = 0;
  auVar749._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar870._8_8_ = 0;
  auVar870._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar633._8_8_ = 0;
  auVar633._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar633,auVar516,auVar217);
  auVar218._8_8_ = 0;
  auVar218._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar218,auVar516);
  auVar14 = vfmadd231sd_fma(auVar14,auVar388,auVar218);
  auVar219._8_8_ = 0;
  auVar219._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar219,auVar749);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar388,auVar219);
  auVar220._8_8_ = 0;
  auVar220._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar870,auVar749);
  auVar14 = vfmadd231sd_fma(auVar14,auVar516,auVar870);
  auVar871._8_8_ = 0;
  auVar871._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar871,auVar749);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar871,auVar388);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar220,auVar749);
  auVar14 = vfmadd231sd_fma(auVar14,auVar220,auVar516);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x67] = auVar14._0_8_;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x28);
  auVar517._8_8_ = 0;
  auVar517._0_8_ = dVar1;
  auVar389._8_8_ = 0;
  auVar389._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar634._8_8_ = 0;
  auVar634._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar872._8_8_ = 0;
  auVar872._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar922._8_8_ = 0;
  auVar922._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar941._8_8_ = 0;
  auVar941._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = dVar2;
  auVar750._8_8_ = 0;
  auVar750._0_8_ = dVar2 * dVar1;
  auVar14 = vfnmadd231sd_fma(auVar750,auVar389,auVar221);
  auVar222._8_8_ = 0;
  auVar222._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar222,auVar634);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar872,auVar222);
  auVar223._8_8_ = 0;
  auVar223._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar223,auVar922);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar223,auVar634);
  auVar635._8_8_ = 0;
  auVar635._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar224._8_8_ = 0;
  auVar224._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar635,auVar941);
  auVar14 = vfmadd231sd_fma(auVar14,auVar635,auVar389);
  auVar390._8_8_ = 0;
  auVar390._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar390,auVar941);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar390,auVar517);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar224,auVar922);
  auVar14 = vfmadd231sd_fma(auVar14,auVar224,auVar872);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x68] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = dVar1;
  auVar873._8_8_ = 0;
  auVar873._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar518._8_8_ = 0;
  auVar518._0_8_ = dVar2;
  auVar391._8_8_ = 0;
  auVar391._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar636._8_8_ = 0;
  auVar636._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar751._8_8_ = 0;
  auVar751._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar751,auVar391,auVar225);
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar226,auVar636);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar518,auVar226);
  auVar227._8_8_ = 0;
  auVar227._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar227,auVar391);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar636,auVar227);
  auVar228._8_8_ = 0;
  auVar228._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar873,auVar391);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar636,auVar873);
  auVar874._8_8_ = 0;
  auVar874._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar874,auVar636);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar518,auVar874);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar228,auVar391);
  auVar14 = vfmadd231sd_fma(auVar14,auVar228,auVar518);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x69] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar392._8_8_ = 0;
  auVar392._0_8_ = dVar2;
  auVar519._8_8_ = 0;
  auVar519._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar752._8_8_ = 0;
  auVar752._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar875._8_8_ = 0;
  auVar875._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar637._8_8_ = 0;
  auVar637._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar637,auVar519,auVar229);
  auVar230._8_8_ = 0;
  auVar230._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar752,auVar875);
  auVar14 = vfmadd231sd_fma(auVar14,auVar752,auVar392);
  auVar14 = vfmadd231sd_fma(auVar14,auVar230,auVar875);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar230,auVar519);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6a] = auVar14._0_8_;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar638._8_8_ = 0;
  auVar638._0_8_ = dVar1;
  auVar520._8_8_ = 0;
  auVar520._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar876._8_8_ = 0;
  auVar876._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar393._8_8_ = 0;
  auVar393._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar923._8_8_ = 0;
  auVar923._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar942._8_8_ = 0;
  auVar942._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar231._8_8_ = 0;
  auVar231._0_8_ = dVar2;
  auVar753._8_8_ = 0;
  auVar753._0_8_ = dVar1 * dVar2;
  auVar14 = vfmsub231sd_fma(auVar753,auVar520,auVar231);
  auVar232._8_8_ = 0;
  auVar232._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar232,auVar876);
  auVar14 = vfmadd231sd_fma(auVar14,auVar393,auVar232);
  auVar233._8_8_ = 0;
  auVar233._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar233,auVar923);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar233,auVar393);
  auVar394._8_8_ = 0;
  auVar394._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar234._8_8_ = 0;
  auVar234._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar394,auVar942);
  auVar14 = vfmadd231sd_fma(auVar14,auVar394,auVar638);
  auVar395._8_8_ = 0;
  auVar395._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar395,auVar942);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar395,auVar520);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar234,auVar923);
  auVar14 = vfmadd231sd_fma(auVar14,auVar234,auVar876);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6b] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = dVar1;
  auVar877._8_8_ = 0;
  auVar877._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar396._8_8_ = 0;
  auVar396._0_8_ = dVar2;
  auVar521._8_8_ = 0;
  auVar521._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar754._8_8_ = 0;
  auVar754._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar639._8_8_ = 0;
  auVar639._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar639,auVar521,auVar235);
  auVar236._8_8_ = 0;
  auVar236._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar236,auVar521);
  auVar14 = vfmadd231sd_fma(auVar14,auVar396,auVar236);
  auVar237._8_8_ = 0;
  auVar237._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar237,auVar754);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar396,auVar237);
  auVar238._8_8_ = 0;
  auVar238._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar877,auVar754);
  auVar14 = vfmadd231sd_fma(auVar14,auVar521,auVar877);
  auVar878._8_8_ = 0;
  auVar878._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar878,auVar754);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar878,auVar396);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar238,auVar754);
  auVar14 = vfmadd231sd_fma(auVar14,auVar238,auVar521);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6c] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar239._8_8_ = 0;
  auVar239._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar522._8_8_ = 0;
  auVar522._0_8_ = dVar2;
  auVar397._8_8_ = 0;
  auVar397._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar640._8_8_ = 0;
  auVar640._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar879._8_8_ = 0;
  auVar879._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar755._8_8_ = 0;
  auVar755._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar755,auVar397,auVar239);
  auVar240._8_8_ = 0;
  auVar240._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfmadd231sd_fma(auVar14,auVar240,auVar640);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar522,auVar240);
  auVar241._8_8_ = 0;
  auVar241._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar241,auVar397);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar640,auVar241);
  auVar242._8_8_ = 0;
  auVar242._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar879,auVar397);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar640,auVar879);
  auVar880._8_8_ = 0;
  auVar880._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar880,auVar640);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar522,auVar880);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar242,auVar397);
  auVar14 = vfmadd231sd_fma(auVar14,auVar242,auVar522);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6d] = auVar14._0_8_;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar641._8_8_ = 0;
  auVar641._0_8_ = dVar1;
  auVar398._8_8_ = 0;
  auVar398._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar881._8_8_ = 0;
  auVar881._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar523._8_8_ = 0;
  auVar523._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar943._8_8_ = 0;
  auVar943._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar951._8_8_ = 0;
  auVar951._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = dVar2;
  auVar924._8_8_ = 0;
  auVar924._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar756._8_8_ = 0;
  auVar756._0_8_ = dVar1 * dVar2;
  auVar14 = vfmsub231sd_fma(auVar756,auVar243,auVar398);
  auVar14 = vfmadd231sd_fma(auVar14,auVar243,auVar881);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar523,auVar243);
  auVar244._8_8_ = 0;
  auVar244._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar924,auVar943);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar924,auVar951);
  auVar14 = vfmadd231sd_fma(auVar14,auVar924,auVar641);
  auVar14 = vfmadd231sd_fma(auVar14,auVar924,auVar523);
  auVar14 = vfmadd231sd_fma(auVar14,auVar244,auVar943);
  auVar14 = vfmadd231sd_fma(auVar14,auVar244,auVar951);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar244,auVar398);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar244,auVar881);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6e] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = dVar1;
  auVar757._8_8_ = 0;
  auVar757._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar399._8_8_ = 0;
  auVar399._0_8_ = dVar2;
  auVar524._8_8_ = 0;
  auVar524._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar882._8_8_ = 0;
  auVar882._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar642._8_8_ = 0;
  auVar642._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar642,auVar524,auVar245);
  auVar246._8_8_ = 0;
  auVar246._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar757,auVar882);
  auVar14 = vfmadd231sd_fma(auVar14,auVar757,auVar399);
  auVar14 = vfmadd231sd_fma(auVar14,auVar246,auVar882);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar246,auVar524);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x6f] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar247._8_8_ = 0;
  auVar247._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar400._8_8_ = 0;
  auVar400._0_8_ = dVar2;
  auVar525._8_8_ = 0;
  auVar525._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar758._8_8_ = 0;
  auVar758._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar883._8_8_ = 0;
  auVar883._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar643._8_8_ = 0;
  auVar643._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar643,auVar525,auVar247);
  auVar248._8_8_ = 0;
  auVar248._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar248,auVar758);
  auVar14 = vfmadd231sd_fma(auVar14,auVar400,auVar248);
  auVar249._8_8_ = 0;
  auVar249._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar249,auVar525);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar400,auVar249);
  auVar250._8_8_ = 0;
  auVar250._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar883,auVar758);
  auVar14 = vfmadd231sd_fma(auVar14,auVar883,auVar400);
  auVar401._8_8_ = 0;
  auVar401._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar401,auVar758);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar525,auVar401);
  auVar14 = vfmadd231sd_fma(auVar14,auVar250,auVar758);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar250,auVar525);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x70] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x18);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar402._8_8_ = 0;
  auVar402._0_8_ = dVar2;
  auVar526._8_8_ = 0;
  auVar526._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar759._8_8_ = 0;
  auVar759._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar884._8_8_ = 0;
  auVar884._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar644._8_8_ = 0;
  auVar644._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar644,auVar526,auVar251);
  auVar252._8_8_ = 0;
  auVar252._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar252,auVar759);
  auVar14 = vfmadd231sd_fma(auVar14,auVar402,auVar252);
  auVar253._8_8_ = 0;
  auVar253._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfmadd231sd_fma(auVar14,auVar253,auVar526);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar402,auVar253);
  auVar254._8_8_ = 0;
  auVar254._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar884,auVar759);
  auVar14 = vfmadd231sd_fma(auVar14,auVar884,auVar402);
  auVar403._8_8_ = 0;
  auVar403._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar403,auVar759);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar526,auVar403);
  auVar14 = vfmadd231sd_fma(auVar14,auVar254,auVar759);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar254,auVar526);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x71] = auVar14._0_8_;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar645._8_8_ = 0;
  auVar645._0_8_ = dVar1;
  auVar404._8_8_ = 0;
  auVar404._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar527._8_8_ = 0;
  auVar527._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar2;
  auVar885._8_8_ = 0;
  auVar885._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar760._8_8_ = 0;
  auVar760._0_8_ = dVar1 * dVar2;
  auVar14 = vfmsub231sd_fma(auVar760,auVar404,auVar255);
  auVar256._8_8_ = 0;
  auVar256._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar885,auVar404);
  auVar14 = vfmadd231sd_fma(auVar14,auVar527,auVar885);
  auVar14 = vfmadd231sd_fma(auVar14,auVar256,auVar645);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar256,auVar527);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x73] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = dVar1;
  auVar886._8_8_ = 0;
  auVar886._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar646._8_8_ = 0;
  auVar646._0_8_ = dVar2;
  auVar405._8_8_ = 0;
  auVar405._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar528._8_8_ = 0;
  auVar528._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar761._8_8_ = 0;
  auVar761._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar761,auVar405,auVar257);
  auVar258._8_8_ = 0;
  auVar258._0_8_ =
       *(double *)
        ((long)&(pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar886,auVar405);
  auVar14 = vfmadd231sd_fma(auVar14,auVar528,auVar886);
  auVar14 = vfmadd231sd_fma(auVar14,auVar258,auVar646);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar258,auVar528);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x74] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar259._8_8_ = 0;
  auVar259._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x10);
  auVar647._8_8_ = 0;
  auVar647._0_8_ = dVar2;
  auVar406._8_8_ = 0;
  auVar406._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar887._8_8_ = 0;
  auVar887._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar529._8_8_ = 0;
  auVar529._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x40);
  auVar762._8_8_ = 0;
  auVar762._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar762,auVar406,auVar259);
  auVar260._8_8_ = 0;
  auVar260._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar887,auVar406);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar529,auVar887);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar260,auVar647);
  auVar14 = vfmadd231sd_fma(auVar14,auVar260,auVar529);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x76] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar530._8_8_ = 0;
  auVar530._0_8_ = dVar2;
  auVar407._8_8_ = 0;
  auVar407._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar888._8_8_ = 0;
  auVar888._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar763._8_8_ = 0;
  auVar763._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar925._8_8_ = 0;
  auVar925._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar944._8_8_ = 0;
  auVar944._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar648._8_8_ = 0;
  auVar648._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar648,auVar261,auVar407);
  auVar14 = vfmadd231sd_fma(auVar14,auVar261,auVar888);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar763,auVar261);
  auVar262._8_8_ = 0;
  auVar262._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar925,auVar944);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar925,auVar530);
  auVar531._8_8_ = 0;
  auVar531._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar925,auVar888);
  auVar14 = vfmadd231sd_fma(auVar14,auVar531,auVar925);
  auVar14 = vfmadd231sd_fma(auVar14,auVar262,auVar407);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar262,auVar944);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar262,auVar531);
  auVar14 = vfmadd231sd_fma(auVar14,auVar262,auVar763);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x77] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar263._8_8_ = 0;
  auVar263._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar2;
  auVar532._8_8_ = 0;
  auVar532._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar764._8_8_ = 0;
  auVar764._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar889._8_8_ = 0;
  auVar889._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar649,auVar532,auVar263);
  auVar264._8_8_ = 0;
  auVar264._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar764,auVar889);
  auVar14 = vfmadd231sd_fma(auVar14,auVar764,auVar408);
  auVar14 = vfmadd231sd_fma(auVar14,auVar264,auVar889);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar264,auVar532);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x78] = auVar14._0_8_;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x40);
  auVar409._8_8_ = 0;
  auVar409._0_8_ = dVar1;
  auVar533._8_8_ = 0;
  auVar533._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar890._8_8_ = 0;
  auVar890._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar265._8_8_ = 0;
  auVar265._0_8_ = dVar2;
  auVar765._8_8_ = 0;
  auVar765._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar650._8_8_ = 0;
  auVar650._0_8_ = dVar2 * dVar1;
  auVar14 = vfnmadd231sd_fma(auVar650,auVar533,auVar265);
  auVar266._8_8_ = 0;
  auVar266._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar765,auVar890);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar765,auVar409);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar266,auVar890);
  auVar14 = vfmadd231sd_fma(auVar14,auVar266,auVar533);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x79] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = dVar1;
  auVar945._8_8_ = 0;
  auVar945._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar534._8_8_ = 0;
  auVar534._0_8_ = dVar2;
  auVar410._8_8_ = 0;
  auVar410._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar766._8_8_ = 0;
  auVar766._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar891._8_8_ = 0;
  auVar891._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar926._8_8_ = 0;
  auVar926._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar651._8_8_ = 0;
  auVar651._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar651,auVar267,auVar410);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar267,auVar766);
  auVar14 = vfmadd231sd_fma(auVar14,auVar891,auVar267);
  auVar268._8_8_ = 0;
  auVar268._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar945,auVar534);
  auVar535._8_8_ = 0;
  auVar535._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar945,auVar535);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar945,auVar926);
  auVar14 = vfmadd231sd_fma(auVar14,auVar945,auVar766);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar268,auVar410);
  auVar14 = vfmadd231sd_fma(auVar14,auVar268,auVar535);
  auVar14 = vfmadd231sd_fma(auVar14,auVar268,auVar926);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar268,auVar891);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7a] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar269._8_8_ = 0;
  auVar269._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar652._8_8_ = 0;
  auVar652._0_8_ = dVar2;
  auVar411._8_8_ = 0;
  auVar411._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar892._8_8_ = 0;
  auVar892._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar536._8_8_ = 0;
  auVar536._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar767._8_8_ = 0;
  auVar767._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar767,auVar411,auVar269);
  auVar270._8_8_ = 0;
  auVar270._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar892,auVar411);
  auVar14 = vfmadd231sd_fma(auVar14,auVar536,auVar892);
  auVar14 = vfmadd231sd_fma(auVar14,auVar270,auVar652);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar270,auVar536);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7b] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x38);
  auVar653._8_8_ = 0;
  auVar653._0_8_ = dVar2;
  auVar412._8_8_ = 0;
  auVar412._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x30);
  auVar893._8_8_ = 0;
  auVar893._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar537._8_8_ = 0;
  auVar537._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar927._8_8_ = 0;
  auVar927._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar946._8_8_ = 0;
  auVar946._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar952._8_8_ = 0;
  auVar952._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar768._8_8_ = 0;
  auVar768._0_8_ = dVar2 * dVar1;
  auVar14 = vfnmsub231sd_fma(auVar768,auVar271,auVar412);
  auVar14 = vfmadd231sd_fma(auVar14,auVar271,auVar893);
  auVar14 = vfmadd231sd_fma(auVar14,auVar537,auVar271);
  auVar272._8_8_ = 0;
  auVar272._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar927,auVar946);
  auVar14 = vfmadd231sd_fma(auVar14,auVar927,auVar952);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar927,auVar893);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar927,auVar537);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar272,auVar946);
  auVar14 = vfmadd231sd_fma(auVar14,auVar272,auVar412);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar272,auVar952);
  auVar14 = vfmadd231sd_fma(auVar14,auVar272,auVar653);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7d] = auVar14._0_8_;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 8);
  auVar654._8_8_ = 0;
  auVar654._0_8_ = dVar1;
  auVar413._8_8_ = 0;
  auVar413._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar538._8_8_ = 0;
  auVar538._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x20);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar273._8_8_ = 0;
  auVar273._0_8_ = dVar2;
  auVar894._8_8_ = 0;
  auVar894._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar769._8_8_ = 0;
  auVar769._0_8_ = dVar2 * dVar1;
  auVar14 = vfnmadd231sd_fma(auVar769,auVar413,auVar273);
  auVar274._8_8_ = 0;
  auVar274._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar894,auVar413);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar538,auVar894);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar274,auVar654);
  auVar14 = vfmadd231sd_fma(auVar14,auVar274,auVar538);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7e] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = dVar1;
  auVar770._8_8_ = 0;
  auVar770._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar414._8_8_ = 0;
  auVar414._0_8_ = dVar2;
  auVar539._8_8_ = 0;
  auVar539._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar895._8_8_ = 0;
  auVar895._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = dVar2 * dVar1;
  auVar14 = vfmsub231sd_fma(auVar655,auVar539,auVar275);
  auVar276._8_8_ = 0;
  auVar276._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar770,auVar895);
  auVar14 = vfmadd231sd_fma(auVar14,auVar770,auVar414);
  auVar14 = vfmadd231sd_fma(auVar14,auVar276,auVar895);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar276,auVar539);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x7f] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar277._8_8_ = 0;
  auVar277._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x30);
  auVar540._8_8_ = 0;
  auVar540._0_8_ = dVar2;
  auVar415._8_8_ = 0;
  auVar415._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar771._8_8_ = 0;
  auVar771._0_8_ =
       *(double *)
        ((long)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar928._8_8_ = 0;
  auVar928._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x38);
  auVar947._8_8_ = 0;
  auVar947._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar896._8_8_ = 0;
  auVar896._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x28);
  auVar656._8_8_ = 0;
  auVar656._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar656,auVar277,auVar415);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar277,auVar771);
  auVar14 = vfmadd231sd_fma(auVar14,auVar928,auVar277);
  auVar278._8_8_ = 0;
  auVar278._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar947,auVar415);
  auVar416._8_8_ = 0;
  auVar416._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x10);
  auVar14 = vfmadd231sd_fma(auVar14,auVar947,auVar771);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar947,auVar416);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar896,auVar947);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar278,auVar540);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar278,auVar928);
  auVar14 = vfmadd231sd_fma(auVar14,auVar278,auVar416);
  auVar14 = vfmadd231sd_fma(auVar14,auVar278,auVar896);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x80] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar279._8_8_ = 0;
  auVar279._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x20);
  auVar417._8_8_ = 0;
  auVar417._0_8_ = dVar2;
  auVar541._8_8_ = 0;
  auVar541._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 8);
  auVar772._8_8_ = 0;
  auVar772._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar897._8_8_ = 0;
  auVar897._0_8_ =
       *(double *)
        ((long)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x18);
  auVar657._8_8_ = 0;
  auVar657._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar657,auVar541,auVar279);
  auVar280._8_8_ = 0;
  auVar280._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar772,auVar897);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar772,auVar417);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar280,auVar897);
  auVar14 = vfmadd231sd_fma(auVar14,auVar280,auVar541);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x81] = auVar14._0_8_;
  pMVar12 = (c123_1->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar658._8_8_ = 0;
  auVar658._0_8_ = dVar1;
  auVar418._8_8_ = 0;
  auVar418._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar542._8_8_ = 0;
  auVar542._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  dVar2 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar281._8_8_ = 0;
  auVar281._0_8_ = dVar2;
  auVar898._8_8_ = 0;
  auVar898._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar773._8_8_ = 0;
  auVar773._0_8_ = dVar1 * dVar2;
  auVar14 = vfmsub231sd_fma(auVar773,auVar418,auVar281);
  auVar282._8_8_ = 0;
  auVar282._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar898,auVar418);
  auVar14 = vfmadd231sd_fma(auVar14,auVar542,auVar898);
  auVar14 = vfmadd231sd_fma(auVar14,auVar282,auVar658);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar282,auVar542);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x82] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x10);
  auVar419._8_8_ = 0;
  auVar419._0_8_ = dVar2;
  auVar543._8_8_ = 0;
  auVar543._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x30);
  auVar774._8_8_ = 0;
  auVar774._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  auVar899._8_8_ = 0;
  auVar899._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar659,auVar543,auVar283);
  auVar284._8_8_ = 0;
  auVar284._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar774,auVar899);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar774,auVar419);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar284,auVar899);
  auVar14 = vfmadd231sd_fma(auVar14,auVar284,auVar543);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x85] = auVar14._0_8_;
  pMVar11 = (c123_2->
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x20);
  auVar285._8_8_ = 0;
  auVar285._0_8_ = dVar1;
  auVar775._8_8_ = 0;
  auVar775._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x38);
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 8);
  auVar420._8_8_ = 0;
  auVar420._0_8_ = dVar2;
  auVar544._8_8_ = 0;
  auVar544._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x18);
  auVar900._8_8_ = 0;
  auVar900._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar660._8_8_ = 0;
  auVar660._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar660,auVar544,auVar285);
  auVar286._8_8_ = 0;
  auVar286._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar14 = vfmadd231sd_fma(auVar14,auVar775,auVar900);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar775,auVar420);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar286,auVar900);
  auVar14 = vfmadd231sd_fma(auVar14,auVar286,auVar544);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x86] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x30);
  auVar661._8_8_ = 0;
  auVar661._0_8_ = dVar2;
  auVar421._8_8_ = 0;
  auVar421._0_8_ =
       *(ulong *)&pMVar11[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar901._8_8_ = 0;
  auVar901._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar545._8_8_ = 0;
  auVar545._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 0x10);
  auVar776._8_8_ = 0;
  auVar776._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar776,auVar421,auVar287);
  auVar288._8_8_ = 0;
  auVar288._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar901,auVar421);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar545,auVar901);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar288,auVar661);
  auVar14 = vfmadd231sd_fma(auVar14,auVar288,auVar545);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x88] = auVar14._0_8_;
  dVar1 = *(double *)
           ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data + 0x38);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = dVar1;
  dVar2 = *(double *)
           ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                   .m_data + 0x18);
  auVar662._8_8_ = 0;
  auVar662._0_8_ = dVar2;
  auVar422._8_8_ = 0;
  auVar422._0_8_ =
       *(ulong *)&pMVar11[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data;
  auVar902._8_8_ = 0;
  auVar902._0_8_ =
       *(double *)
        ((long)&pMVar12[2].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x28);
  auVar546._8_8_ = 0;
  auVar546._0_8_ =
       *(double *)
        ((long)&(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                m_data + 8);
  auVar777._8_8_ = 0;
  auVar777._0_8_ = dVar1 * dVar2;
  auVar14 = vfnmadd231sd_fma(auVar777,auVar422,auVar289);
  auVar290._8_8_ = 0;
  auVar290._0_8_ =
       *(double *)
        ((long)&pMVar12[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data + 0x40);
  auVar14 = vfmadd231sd_fma(auVar14,auVar902,auVar422);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar546,auVar902);
  auVar14 = vfnmadd231sd_fma(auVar14,auVar290,auVar662);
  auVar14 = vfmadd231sd_fma(auVar14,auVar290,auVar546);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_1,_197,_1,_1,_197>_>).
  m_storage.m_data.array[0x89] = auVar14._0_8_;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix<double,1,197>
opengv::relative_pose::modules::fivept_kneip::initEpncpRowR(
    std::vector<Eigen::Matrix3d,Eigen::aligned_allocator<Eigen::Matrix3d> > & c123_1,
    std::vector<Eigen::Matrix3d,Eigen::aligned_allocator<Eigen::Matrix3d> > & c123_2 )
{
  Eigen::Matrix<double,1,197> row = Eigen::Matrix<double,1,197>::Zero();
  row(0,0) = -c123_1[1](0,0)*c123_2[2](1,2)+c123_1[1](0,0)*c123_2[2](2,1)+c123_1[0](0,1)*c123_2[2](1,2)-c123_1[0](0,1)*c123_2[1](2,2)-c123_1[0](1,0)*c123_2[2](2,1)+c123_1[0](1,0)*c123_2[1](2,2);
  row(0,1) = -c123_1[1](0,0)*c123_2[1](1,2)+c123_1[1](0,0)*c123_2[1](2,1)+c123_1[0](0,1)*c123_2[2](1,1)-c123_1[0](0,1)*c123_2[1](2,1)-c123_1[0](1,0)*c123_2[2](1,1)+c123_1[0](1,0)*c123_2[1](1,2);
  row(0,2) = -c123_1[1](0,0)*c123_2[2](0,2)+c123_1[1](0,0)*c123_2[2](2,0)+c123_1[0](0,1)*c123_2[2](0,2)-c123_1[0](0,1)*c123_2[0](2,2)-c123_1[0](1,0)*c123_2[2](2,0)+c123_1[0](1,0)*c123_2[0](2,2);
  row(0,3) = -c123_1[1](0,0)*c123_2[1](0,2)-c123_1[1](0,0)*c123_2[0](1,2)+c123_1[1](0,0)*c123_2[1](2,0)+c123_1[1](0,0)*c123_2[0](2,1)+c123_1[0](0,1)*c123_2[2](0,1)+c123_1[0](0,1)*c123_2[2](1,0)-c123_1[0](0,1)*c123_2[1](2,0)-c123_1[0](0,1)*c123_2[0](2,1)-c123_1[0](1,0)*c123_2[2](0,1)+c123_1[0](1,0)*c123_2[1](0,2)-c123_1[0](1,0)*c123_2[2](1,0)+c123_1[0](1,0)*c123_2[0](1,2);
  row(0,4) = -c123_1[1](0,0)*c123_2[0](0,2)+c123_1[1](0,0)*c123_2[0](2,0)+c123_1[0](0,1)*c123_2[2](0,0)-c123_1[0](0,1)*c123_2[0](2,0)-c123_1[0](1,0)*c123_2[2](0,0)+c123_1[0](1,0)*c123_2[0](0,2);
  row(0,5) = c123_1[2](0,0)*c123_2[2](1,2)-c123_1[2](0,0)*c123_2[2](2,1)-c123_1[0](0,2)*c123_2[2](1,2)+c123_1[0](0,2)*c123_2[1](2,2)+c123_1[0](2,0)*c123_2[2](2,1)-c123_1[0](2,0)*c123_2[1](2,2);
  row(0,6) = c123_1[2](0,0)*c123_2[2](0,2)-c123_1[2](0,0)*c123_2[2](2,0)-c123_1[0](0,2)*c123_2[2](0,2)+c123_1[0](0,2)*c123_2[0](2,2)+c123_1[0](2,0)*c123_2[2](2,0)-c123_1[0](2,0)*c123_2[0](2,2);
  row(0,7) = c123_1[1](0,0)*c123_2[2](1,2)-c123_1[1](0,0)*c123_2[2](2,1)-c123_1[0](0,1)*c123_2[2](1,2)+c123_1[0](0,1)*c123_2[1](2,2)+c123_1[0](1,0)*c123_2[2](2,1)-c123_1[0](1,0)*c123_2[1](2,2);
  row(0,8) = c123_1[1](0,0)*c123_2[1](1,2)-c123_1[1](0,0)*c123_2[1](2,1)-c123_1[0](0,1)*c123_2[2](1,1)+c123_1[0](0,1)*c123_2[1](2,1)+c123_1[0](1,0)*c123_2[2](1,1)-c123_1[0](1,0)*c123_2[1](1,2);
  row(0,10) = -c123_1[1](0,0)*c123_2[2](0,1)+c123_1[1](0,0)*c123_2[2](1,0)+c123_1[1](0,0)*c123_2[0](1,2)-c123_1[1](0,0)*c123_2[0](2,1)+c123_1[0](0,1)*c123_2[1](0,2)-c123_1[0](0,1)*c123_2[2](1,0)-c123_1[0](0,1)*c123_2[0](1,2)+c123_1[0](0,1)*c123_2[1](2,0)+c123_1[0](1,0)*c123_2[2](0,1)-c123_1[0](1,0)*c123_2[1](0,2)-c123_1[0](1,0)*c123_2[1](2,0)+c123_1[0](1,0)*c123_2[0](2,1);
  row(0,11) = -c123_1[1](0,0)*c123_2[1](0,1)+c123_1[1](0,0)*c123_2[1](1,0)+c123_1[0](0,1)*c123_2[1](0,1)-c123_1[0](0,1)*c123_2[0](1,1)-c123_1[0](1,0)*c123_2[1](1,0)+c123_1[0](1,0)*c123_2[0](1,1);
  row(0,12) = -c123_1[1](0,0)*c123_2[0](0,1)+c123_1[1](0,0)*c123_2[0](1,0)+c123_1[0](0,1)*c123_2[1](0,0)-c123_1[0](0,1)*c123_2[0](1,0)-c123_1[0](1,0)*c123_2[1](0,0)+c123_1[0](1,0)*c123_2[0](0,1);
  row(0,13) = -c123_1[2](0,0)*c123_2[2](1,2)+c123_1[2](0,0)*c123_2[2](2,1)+c123_1[0](0,2)*c123_2[2](1,2)-c123_1[0](0,2)*c123_2[1](2,2)-c123_1[0](2,0)*c123_2[2](2,1)+c123_1[0](2,0)*c123_2[1](2,2);
  row(0,14) = c123_1[2](0,0)*c123_2[1](1,2)-c123_1[2](0,0)*c123_2[1](2,1)-c123_1[0](0,2)*c123_2[2](1,1)+c123_1[0](0,2)*c123_2[1](2,1)+c123_1[0](2,0)*c123_2[2](1,1)-c123_1[0](2,0)*c123_2[1](1,2);
  row(0,15) = c123_1[2](0,0)*c123_2[2](0,1)+c123_1[2](0,0)*c123_2[1](0,2)-c123_1[2](0,0)*c123_2[2](1,0)-c123_1[2](0,0)*c123_2[1](2,0)-c123_1[0](0,2)*c123_2[2](0,1)-c123_1[0](0,2)*c123_2[1](0,2)+c123_1[0](0,2)*c123_2[0](1,2)+c123_1[0](0,2)*c123_2[0](2,1)+c123_1[0](2,0)*c123_2[2](1,0)-c123_1[0](2,0)*c123_2[0](1,2)+c123_1[0](2,0)*c123_2[1](2,0)-c123_1[0](2,0)*c123_2[0](2,1);
  row(0,16) = -c123_1[2](0,0)*c123_2[1](1,2)+c123_1[2](0,0)*c123_2[1](2,1)+c123_1[0](0,2)*c123_2[2](1,1)-c123_1[0](0,2)*c123_2[1](2,1)-c123_1[0](2,0)*c123_2[2](1,1)+c123_1[0](2,0)*c123_2[1](1,2);
  row(0,18) = c123_1[2](0,0)*c123_2[1](0,1)-c123_1[2](0,0)*c123_2[1](1,0)-c123_1[0](0,2)*c123_2[1](0,1)+c123_1[0](0,2)*c123_2[0](1,1)+c123_1[0](2,0)*c123_2[1](1,0)-c123_1[0](2,0)*c123_2[0](1,1);
  row(0,19) = c123_1[1](0,0)*c123_2[2](0,2)-c123_1[1](0,0)*c123_2[2](2,0)-c123_1[0](0,1)*c123_2[2](0,2)+c123_1[0](0,1)*c123_2[0](2,2)+c123_1[0](1,0)*c123_2[2](2,0)-c123_1[0](1,0)*c123_2[0](2,2);
  row(0,20) = c123_1[1](0,0)*c123_2[2](0,1)+c123_1[1](0,0)*c123_2[1](0,2)-c123_1[1](0,0)*c123_2[2](1,0)-c123_1[1](0,0)*c123_2[1](2,0)-c123_1[0](0,1)*c123_2[2](0,1)-c123_1[0](0,1)*c123_2[1](0,2)+c123_1[0](0,1)*c123_2[0](1,2)+c123_1[0](0,1)*c123_2[0](2,1)+c123_1[0](1,0)*c123_2[2](1,0)-c123_1[0](1,0)*c123_2[0](1,2)+c123_1[0](1,0)*c123_2[1](2,0)-c123_1[0](1,0)*c123_2[0](2,1);
  row(0,21) = c123_1[1](0,0)*c123_2[1](0,1)-c123_1[1](0,0)*c123_2[1](1,0)-c123_1[0](0,1)*c123_2[1](0,1)+c123_1[0](0,1)*c123_2[0](1,1)+c123_1[0](1,0)*c123_2[1](1,0)-c123_1[0](1,0)*c123_2[0](1,1);
  row(0,22) = c123_1[1](0,0)*c123_2[0](0,2)-c123_1[1](0,0)*c123_2[0](2,0)-c123_1[0](0,1)*c123_2[2](0,0)+c123_1[0](0,1)*c123_2[0](2,0)+c123_1[0](1,0)*c123_2[2](0,0)-c123_1[0](1,0)*c123_2[0](0,2);
  row(0,23) = c123_1[1](0,0)*c123_2[0](0,1)-c123_1[1](0,0)*c123_2[0](1,0)-c123_1[0](0,1)*c123_2[1](0,0)+c123_1[0](0,1)*c123_2[0](1,0)+c123_1[0](1,0)*c123_2[1](0,0)-c123_1[0](1,0)*c123_2[0](0,1);
  row(0,25) = -c123_1[2](0,0)*c123_2[2](0,2)+c123_1[2](0,0)*c123_2[2](2,0)+c123_1[0](0,2)*c123_2[2](0,2)-c123_1[0](0,2)*c123_2[0](2,2)-c123_1[0](2,0)*c123_2[2](2,0)+c123_1[0](2,0)*c123_2[0](2,2);
  row(0,26) = -c123_1[2](0,0)*c123_2[2](0,1)+c123_1[2](0,0)*c123_2[2](1,0)+c123_1[2](0,0)*c123_2[0](1,2)-c123_1[2](0,0)*c123_2[0](2,1)+c123_1[0](0,2)*c123_2[1](0,2)-c123_1[0](0,2)*c123_2[2](1,0)-c123_1[0](0,2)*c123_2[0](1,2)+c123_1[0](0,2)*c123_2[1](2,0)+c123_1[0](2,0)*c123_2[2](0,1)-c123_1[0](2,0)*c123_2[1](0,2)-c123_1[0](2,0)*c123_2[1](2,0)+c123_1[0](2,0)*c123_2[0](2,1);
  row(0,27) = c123_1[2](0,0)*c123_2[0](0,2)-c123_1[2](0,0)*c123_2[0](2,0)-c123_1[0](0,2)*c123_2[2](0,0)+c123_1[0](0,2)*c123_2[0](2,0)+c123_1[0](2,0)*c123_2[2](0,0)-c123_1[0](2,0)*c123_2[0](0,2);
  row(0,28) = -c123_1[2](0,0)*c123_2[1](0,2)-c123_1[2](0,0)*c123_2[0](1,2)+c123_1[2](0,0)*c123_2[1](2,0)+c123_1[2](0,0)*c123_2[0](2,1)+c123_1[0](0,2)*c123_2[2](0,1)+c123_1[0](0,2)*c123_2[2](1,0)-c123_1[0](0,2)*c123_2[1](2,0)-c123_1[0](0,2)*c123_2[0](2,1)-c123_1[0](2,0)*c123_2[2](0,1)+c123_1[0](2,0)*c123_2[1](0,2)-c123_1[0](2,0)*c123_2[2](1,0)+c123_1[0](2,0)*c123_2[0](1,2);
  row(0,29) = -c123_1[2](0,0)*c123_2[1](0,1)+c123_1[2](0,0)*c123_2[1](1,0)+c123_1[0](0,2)*c123_2[1](0,1)-c123_1[0](0,2)*c123_2[0](1,1)-c123_1[0](2,0)*c123_2[1](1,0)+c123_1[0](2,0)*c123_2[0](1,1);
  row(0,30) = c123_1[2](0,0)*c123_2[0](0,1)-c123_1[2](0,0)*c123_2[0](1,0)-c123_1[0](0,2)*c123_2[1](0,0)+c123_1[0](0,2)*c123_2[0](1,0)+c123_1[0](2,0)*c123_2[1](0,0)-c123_1[0](2,0)*c123_2[0](0,1);
  row(0,33) = -c123_1[2](0,0)*c123_2[0](0,2)+c123_1[2](0,0)*c123_2[0](2,0)+c123_1[0](0,2)*c123_2[2](0,0)-c123_1[0](0,2)*c123_2[0](2,0)-c123_1[0](2,0)*c123_2[2](0,0)+c123_1[0](2,0)*c123_2[0](0,2);
  row(0,34) = -c123_1[2](0,0)*c123_2[0](0,1)+c123_1[2](0,0)*c123_2[0](1,0)+c123_1[0](0,2)*c123_2[1](0,0)-c123_1[0](0,2)*c123_2[0](1,0)-c123_1[0](2,0)*c123_2[1](0,0)+c123_1[0](2,0)*c123_2[0](0,1);
  row(0,39) = -c123_1[1](0,1)*c123_2[2](2,1)+c123_1[1](0,1)*c123_2[1](2,2)+c123_1[1](1,0)*c123_2[2](1,2)-c123_1[1](1,0)*c123_2[1](2,2)-c123_1[0](1,1)*c123_2[2](1,2)+c123_1[0](1,1)*c123_2[2](2,1);
  row(0,40) = -c123_1[1](0,1)*c123_2[2](1,1)+c123_1[1](0,1)*c123_2[1](1,2)+c123_1[1](1,0)*c123_2[2](1,1)-c123_1[1](1,0)*c123_2[1](2,1)-c123_1[0](1,1)*c123_2[1](1,2)+c123_1[0](1,1)*c123_2[1](2,1);
  row(0,41) = -c123_1[1](0,1)*c123_2[2](2,0)+c123_1[1](0,1)*c123_2[0](2,2)+c123_1[1](1,0)*c123_2[2](0,2)-c123_1[1](1,0)*c123_2[0](2,2)-c123_1[0](1,1)*c123_2[2](0,2)+c123_1[0](1,1)*c123_2[2](2,0);
  row(0,42) = -c123_1[1](0,1)*c123_2[2](0,1)+c123_1[1](0,1)*c123_2[1](0,2)-c123_1[1](0,1)*c123_2[2](1,0)+c123_1[1](0,1)*c123_2[0](1,2)+c123_1[1](1,0)*c123_2[2](0,1)+c123_1[1](1,0)*c123_2[2](1,0)-c123_1[1](1,0)*c123_2[1](2,0)-c123_1[1](1,0)*c123_2[0](2,1)-c123_1[0](1,1)*c123_2[1](0,2)-c123_1[0](1,1)*c123_2[0](1,2)+c123_1[0](1,1)*c123_2[1](2,0)+c123_1[0](1,1)*c123_2[0](2,1);
  row(0,43) = -c123_1[1](0,1)*c123_2[2](0,0)+c123_1[1](0,1)*c123_2[0](0,2)+c123_1[1](1,0)*c123_2[2](0,0)-c123_1[1](1,0)*c123_2[0](2,0)-c123_1[0](1,1)*c123_2[0](0,2)+c123_1[0](1,1)*c123_2[0](2,0);
  row(0,44) = -c123_1[2](0,1)*c123_2[2](1,2)+c123_1[2](0,1)*c123_2[2](2,1)+c123_1[1](0,2)*c123_2[2](1,2)-c123_1[1](0,2)*c123_2[1](2,2)-c123_1[2](1,0)*c123_2[2](1,2)+c123_1[2](1,0)*c123_2[2](2,1)+c123_1[0](1,2)*c123_2[2](1,2)-c123_1[0](1,2)*c123_2[1](2,2)-c123_1[1](2,0)*c123_2[2](2,1)+c123_1[1](2,0)*c123_2[1](2,2)-c123_1[0](2,1)*c123_2[2](2,1)+c123_1[0](2,1)*c123_2[1](2,2);
  row(0,45) = -c123_1[2](0,1)*c123_2[2](0,2)+c123_1[2](0,1)*c123_2[2](2,0)+c123_1[1](0,2)*c123_2[2](0,2)-c123_1[1](0,2)*c123_2[0](2,2)-c123_1[2](1,0)*c123_2[2](0,2)+c123_1[2](1,0)*c123_2[2](2,0)+c123_1[0](1,2)*c123_2[2](0,2)-c123_1[0](1,2)*c123_2[0](2,2)-c123_1[1](2,0)*c123_2[2](2,0)+c123_1[1](2,0)*c123_2[0](2,2)-c123_1[0](2,1)*c123_2[2](2,0)+c123_1[0](2,1)*c123_2[0](2,2);
  row(0,46) = c123_1[2](0,1)*c123_2[2](1,2)-c123_1[2](0,1)*c123_2[1](2,2)-c123_1[1](0,2)*c123_2[2](1,2)+c123_1[1](0,2)*c123_2[2](2,1)-c123_1[2](1,0)*c123_2[2](2,1)+c123_1[2](1,0)*c123_2[1](2,2)-c123_1[0](1,2)*c123_2[2](2,1)+c123_1[0](1,2)*c123_2[1](2,2)-c123_1[1](2,0)*c123_2[2](1,2)+c123_1[1](2,0)*c123_2[2](2,1)+c123_1[0](2,1)*c123_2[2](1,2)-c123_1[0](2,1)*c123_2[1](2,2);
  row(0,47) = c123_1[2](0,1)*c123_2[2](1,1)-c123_1[2](0,1)*c123_2[1](1,2)+c123_1[1](0,2)*c123_2[2](1,1)-c123_1[1](0,2)*c123_2[1](1,2)-c123_1[2](1,0)*c123_2[2](1,1)+c123_1[2](1,0)*c123_2[1](2,1)+c123_1[0](1,2)*c123_2[1](1,2)-c123_1[0](1,2)*c123_2[1](2,1)-c123_1[1](2,0)*c123_2[2](1,1)+c123_1[1](2,0)*c123_2[1](2,1)+c123_1[0](2,1)*c123_2[1](1,2)-c123_1[0](2,1)*c123_2[1](2,1);
  row(0,48) = -c123_1[2](0,1)*c123_2[1](0,2)+c123_1[2](0,1)*c123_2[2](1,0)+c123_1[1](0,2)*c123_2[2](0,1)-c123_1[1](0,2)*c123_2[0](1,2)-c123_1[2](1,0)*c123_2[2](0,1)+c123_1[2](1,0)*c123_2[1](2,0)+c123_1[0](1,2)*c123_2[1](0,2)-c123_1[0](1,2)*c123_2[0](2,1)-c123_1[1](2,0)*c123_2[2](1,0)+c123_1[1](2,0)*c123_2[0](2,1)+c123_1[0](2,1)*c123_2[0](1,2)-c123_1[0](2,1)*c123_2[1](2,0);
  row(0,49) = -c123_1[2](0,2)*c123_2[2](2,1)+c123_1[2](0,2)*c123_2[1](2,2)+c123_1[2](2,0)*c123_2[2](1,2)-c123_1[2](2,0)*c123_2[1](2,2)-c123_1[0](2,2)*c123_2[2](1,2)+c123_1[0](2,2)*c123_2[2](2,1);
  row(0,50) = -c123_1[2](0,2)*c123_2[2](1,1)+c123_1[2](0,2)*c123_2[1](1,2)+c123_1[2](2,0)*c123_2[2](1,1)-c123_1[2](2,0)*c123_2[1](2,1)-c123_1[0](2,2)*c123_2[1](1,2)+c123_1[0](2,2)*c123_2[1](2,1);
  row(0,51) = c123_1[2](0,1)*c123_2[2](0,2)-c123_1[2](0,1)*c123_2[0](2,2)-c123_1[1](0,2)*c123_2[2](0,2)+c123_1[1](0,2)*c123_2[2](2,0)-c123_1[2](1,0)*c123_2[2](2,0)+c123_1[2](1,0)*c123_2[0](2,2)-c123_1[0](1,2)*c123_2[2](2,0)+c123_1[0](1,2)*c123_2[0](2,2)-c123_1[1](2,0)*c123_2[2](0,2)+c123_1[1](2,0)*c123_2[2](2,0)+c123_1[0](2,1)*c123_2[2](0,2)-c123_1[0](2,1)*c123_2[0](2,2);
  row(0,52) = c123_1[2](0,1)*c123_2[2](0,1)-c123_1[2](0,1)*c123_2[0](1,2)-c123_1[1](0,2)*c123_2[1](0,2)+c123_1[1](0,2)*c123_2[2](1,0)-c123_1[2](1,0)*c123_2[2](1,0)+c123_1[2](1,0)*c123_2[0](2,1)+c123_1[0](1,2)*c123_2[0](1,2)-c123_1[0](1,2)*c123_2[1](2,0)-c123_1[1](2,0)*c123_2[2](0,1)+c123_1[1](2,0)*c123_2[1](2,0)+c123_1[0](2,1)*c123_2[1](0,2)-c123_1[0](2,1)*c123_2[0](2,1);
  row(0,53) = c123_1[2](0,1)*c123_2[2](0,0)-c123_1[2](0,1)*c123_2[0](0,2)+c123_1[1](0,2)*c123_2[2](0,0)-c123_1[1](0,2)*c123_2[0](0,2)-c123_1[2](1,0)*c123_2[2](0,0)+c123_1[2](1,0)*c123_2[0](2,0)+c123_1[0](1,2)*c123_2[0](0,2)-c123_1[0](1,2)*c123_2[0](2,0)-c123_1[1](2,0)*c123_2[2](0,0)+c123_1[1](2,0)*c123_2[0](2,0)+c123_1[0](2,1)*c123_2[0](0,2)-c123_1[0](2,1)*c123_2[0](2,0);
  row(0,54) = -c123_1[2](0,2)*c123_2[2](2,0)+c123_1[2](0,2)*c123_2[0](2,2)+c123_1[2](2,0)*c123_2[2](0,2)-c123_1[2](2,0)*c123_2[0](2,2)-c123_1[0](2,2)*c123_2[2](0,2)+c123_1[0](2,2)*c123_2[2](2,0);
  row(0,55) = -c123_1[2](0,2)*c123_2[2](0,1)+c123_1[2](0,2)*c123_2[1](0,2)-c123_1[2](0,2)*c123_2[2](1,0)+c123_1[2](0,2)*c123_2[0](1,2)+c123_1[2](2,0)*c123_2[2](0,1)+c123_1[2](2,0)*c123_2[2](1,0)-c123_1[2](2,0)*c123_2[1](2,0)-c123_1[2](2,0)*c123_2[0](2,1)-c123_1[0](2,2)*c123_2[1](0,2)-c123_1[0](2,2)*c123_2[0](1,2)+c123_1[0](2,2)*c123_2[1](2,0)+c123_1[0](2,2)*c123_2[0](2,1);
  row(0,56) = -c123_1[2](0,2)*c123_2[2](0,0)+c123_1[2](0,2)*c123_2[0](0,2)+c123_1[2](2,0)*c123_2[2](0,0)-c123_1[2](2,0)*c123_2[0](2,0)-c123_1[0](2,2)*c123_2[0](0,2)+c123_1[0](2,2)*c123_2[0](2,0);
  row(0,57) = c123_1[2](1,1)*c123_2[2](1,2)-c123_1[2](1,1)*c123_2[2](2,1)-c123_1[1](1,2)*c123_2[2](1,2)+c123_1[1](1,2)*c123_2[1](2,2)+c123_1[1](2,1)*c123_2[2](2,1)-c123_1[1](2,1)*c123_2[1](2,2);
  row(0,58) = c123_1[2](1,1)*c123_2[2](0,2)-c123_1[2](1,1)*c123_2[2](2,0)-c123_1[1](1,2)*c123_2[2](0,2)+c123_1[1](1,2)*c123_2[0](2,2)+c123_1[1](2,1)*c123_2[2](2,0)-c123_1[1](2,1)*c123_2[0](2,2);
  row(0,59) = c123_1[2](1,2)*c123_2[2](2,1)-c123_1[2](1,2)*c123_2[1](2,2)-c123_1[2](2,1)*c123_2[2](1,2)+c123_1[2](2,1)*c123_2[1](2,2)+c123_1[1](2,2)*c123_2[2](1,2)-c123_1[1](2,2)*c123_2[2](2,1);
  row(0,60) = c123_1[2](1,2)*c123_2[2](2,0)-c123_1[2](1,2)*c123_2[0](2,2)-c123_1[2](2,1)*c123_2[2](0,2)+c123_1[2](2,1)*c123_2[0](2,2)+c123_1[1](2,2)*c123_2[2](0,2)-c123_1[1](2,2)*c123_2[2](2,0);
  row(0,61) = c123_1[1](0,1)*c123_2[2](2,1)-c123_1[1](0,1)*c123_2[1](2,2)-c123_1[1](1,0)*c123_2[2](1,2)+c123_1[1](1,0)*c123_2[1](2,2)+c123_1[0](1,1)*c123_2[2](1,2)-c123_1[0](1,1)*c123_2[2](2,1);
  row(0,62) = c123_1[1](0,1)*c123_2[2](1,1)-c123_1[1](0,1)*c123_2[1](1,2)-c123_1[1](1,0)*c123_2[2](1,1)+c123_1[1](1,0)*c123_2[1](2,1)+c123_1[0](1,1)*c123_2[1](1,2)-c123_1[0](1,1)*c123_2[1](2,1);
  row(0,64) = c123_1[1](0,1)*c123_2[2](0,1)-c123_1[1](0,1)*c123_2[1](0,2)-c123_1[1](0,1)*c123_2[1](2,0)+c123_1[1](0,1)*c123_2[0](2,1)+c123_1[1](1,0)*c123_2[1](0,2)-c123_1[1](1,0)*c123_2[2](1,0)-c123_1[1](1,0)*c123_2[0](1,2)+c123_1[1](1,0)*c123_2[1](2,0)-c123_1[0](1,1)*c123_2[2](0,1)+c123_1[0](1,1)*c123_2[2](1,0)+c123_1[0](1,1)*c123_2[0](1,2)-c123_1[0](1,1)*c123_2[0](2,1);
  row(0,65) = -c123_1[1](0,1)*c123_2[1](1,0)+c123_1[1](0,1)*c123_2[0](1,1)+c123_1[1](1,0)*c123_2[1](0,1)-c123_1[1](1,0)*c123_2[0](1,1)-c123_1[0](1,1)*c123_2[1](0,1)+c123_1[0](1,1)*c123_2[1](1,0);
  row(0,66) = -c123_1[1](0,1)*c123_2[1](0,0)+c123_1[1](0,1)*c123_2[0](0,1)+c123_1[1](1,0)*c123_2[1](0,0)-c123_1[1](1,0)*c123_2[0](1,0)-c123_1[0](1,1)*c123_2[0](0,1)+c123_1[0](1,1)*c123_2[0](1,0);
  row(0,67) = -c123_1[2](0,1)*c123_2[2](2,1)+c123_1[2](0,1)*c123_2[1](2,2)-c123_1[1](0,2)*c123_2[2](2,1)+c123_1[1](0,2)*c123_2[1](2,2)+c123_1[2](1,0)*c123_2[2](1,2)-c123_1[2](1,0)*c123_2[1](2,2)-c123_1[0](1,2)*c123_2[2](1,2)+c123_1[0](1,2)*c123_2[2](2,1)+c123_1[1](2,0)*c123_2[2](1,2)-c123_1[1](2,0)*c123_2[1](2,2)-c123_1[0](2,1)*c123_2[2](1,2)+c123_1[0](2,1)*c123_2[2](2,1);
  row(0,68) = -c123_1[2](0,1)*c123_2[2](1,1)+c123_1[2](0,1)*c123_2[1](2,1)+c123_1[1](0,2)*c123_2[1](1,2)-c123_1[1](0,2)*c123_2[1](2,1)+c123_1[2](1,0)*c123_2[2](1,1)-c123_1[2](1,0)*c123_2[1](1,2)+c123_1[0](1,2)*c123_2[2](1,1)-c123_1[0](1,2)*c123_2[1](1,2)+c123_1[1](2,0)*c123_2[1](1,2)-c123_1[1](2,0)*c123_2[1](2,1)-c123_1[0](2,1)*c123_2[2](1,1)+c123_1[0](2,1)*c123_2[1](2,1);
  row(0,69) = -c123_1[2](0,1)*c123_2[2](0,1)+c123_1[2](0,1)*c123_2[1](2,0)+c123_1[1](0,2)*c123_2[1](0,2)-c123_1[1](0,2)*c123_2[0](2,1)-c123_1[2](1,0)*c123_2[1](0,2)+c123_1[2](1,0)*c123_2[2](1,0)+c123_1[0](1,2)*c123_2[2](0,1)-c123_1[0](1,2)*c123_2[0](1,2)+c123_1[1](2,0)*c123_2[0](1,2)-c123_1[1](2,0)*c123_2[1](2,0)-c123_1[0](2,1)*c123_2[2](1,0)+c123_1[0](2,1)*c123_2[0](2,1);
  row(0,70) = c123_1[2](0,2)*c123_2[2](2,1)-c123_1[2](0,2)*c123_2[1](2,2)-c123_1[2](2,0)*c123_2[2](1,2)+c123_1[2](2,0)*c123_2[1](2,2)+c123_1[0](2,2)*c123_2[2](1,2)-c123_1[0](2,2)*c123_2[2](2,1);
  row(0,71) = c123_1[2](0,1)*c123_2[1](1,2)-c123_1[2](0,1)*c123_2[1](2,1)-c123_1[1](0,2)*c123_2[2](1,1)+c123_1[1](0,2)*c123_2[1](2,1)+c123_1[2](1,0)*c123_2[1](1,2)-c123_1[2](1,0)*c123_2[1](2,1)-c123_1[0](1,2)*c123_2[2](1,1)+c123_1[0](1,2)*c123_2[1](2,1)+c123_1[1](2,0)*c123_2[2](1,1)-c123_1[1](2,0)*c123_2[1](1,2)+c123_1[0](2,1)*c123_2[2](1,1)-c123_1[0](2,1)*c123_2[1](1,2);
  row(0,73) = -c123_1[2](0,1)*c123_2[1](0,1)+c123_1[2](0,1)*c123_2[1](1,0)+c123_1[1](0,2)*c123_2[1](0,1)-c123_1[1](0,2)*c123_2[0](1,1)-c123_1[2](1,0)*c123_2[1](0,1)+c123_1[2](1,0)*c123_2[1](1,0)+c123_1[0](1,2)*c123_2[1](0,1)-c123_1[0](1,2)*c123_2[0](1,1)-c123_1[1](2,0)*c123_2[1](1,0)+c123_1[1](2,0)*c123_2[0](1,1)-c123_1[0](2,1)*c123_2[1](1,0)+c123_1[0](2,1)*c123_2[0](1,1);
  row(0,74) = c123_1[2](0,2)*c123_2[2](1,1)-c123_1[2](0,2)*c123_2[1](1,2)-c123_1[2](2,0)*c123_2[2](1,1)+c123_1[2](2,0)*c123_2[1](2,1)+c123_1[0](2,2)*c123_2[1](1,2)-c123_1[0](2,2)*c123_2[1](2,1);
  row(0,76) = c123_1[2](0,1)*c123_2[1](0,2)-c123_1[2](0,1)*c123_2[0](2,1)-c123_1[1](0,2)*c123_2[2](0,1)+c123_1[1](0,2)*c123_2[1](2,0)+c123_1[2](1,0)*c123_2[0](1,2)-c123_1[2](1,0)*c123_2[1](2,0)-c123_1[0](1,2)*c123_2[2](1,0)+c123_1[0](1,2)*c123_2[0](2,1)-c123_1[1](2,0)*c123_2[1](0,2)+c123_1[1](2,0)*c123_2[2](1,0)+c123_1[0](2,1)*c123_2[2](0,1)-c123_1[0](2,1)*c123_2[0](1,2);
  row(0,77) = c123_1[2](0,1)*c123_2[1](0,1)-c123_1[2](0,1)*c123_2[0](1,1)-c123_1[1](0,2)*c123_2[1](0,1)+c123_1[1](0,2)*c123_2[1](1,0)-c123_1[2](1,0)*c123_2[1](1,0)+c123_1[2](1,0)*c123_2[0](1,1)-c123_1[0](1,2)*c123_2[1](1,0)+c123_1[0](1,2)*c123_2[0](1,1)-c123_1[1](2,0)*c123_2[1](0,1)+c123_1[1](2,0)*c123_2[1](1,0)+c123_1[0](2,1)*c123_2[1](0,1)-c123_1[0](2,1)*c123_2[0](1,1);
  row(0,78) = c123_1[2](0,1)*c123_2[1](0,0)-c123_1[2](0,1)*c123_2[0](0,1)+c123_1[1](0,2)*c123_2[1](0,0)-c123_1[1](0,2)*c123_2[0](0,1)-c123_1[2](1,0)*c123_2[1](0,0)+c123_1[2](1,0)*c123_2[0](1,0)+c123_1[0](1,2)*c123_2[0](0,1)-c123_1[0](1,2)*c123_2[0](1,0)-c123_1[1](2,0)*c123_2[1](0,0)+c123_1[1](2,0)*c123_2[0](1,0)+c123_1[0](2,1)*c123_2[0](0,1)-c123_1[0](2,1)*c123_2[0](1,0);
  row(0,79) = c123_1[2](0,2)*c123_2[2](0,1)-c123_1[2](0,2)*c123_2[1](0,2)-c123_1[2](0,2)*c123_2[1](2,0)+c123_1[2](0,2)*c123_2[0](2,1)+c123_1[2](2,0)*c123_2[1](0,2)-c123_1[2](2,0)*c123_2[2](1,0)-c123_1[2](2,0)*c123_2[0](1,2)+c123_1[2](2,0)*c123_2[1](2,0)-c123_1[0](2,2)*c123_2[2](0,1)+c123_1[0](2,2)*c123_2[2](1,0)+c123_1[0](2,2)*c123_2[0](1,2)-c123_1[0](2,2)*c123_2[0](2,1);
  row(0,80) = -c123_1[2](0,2)*c123_2[1](1,0)+c123_1[2](0,2)*c123_2[0](1,1)+c123_1[2](2,0)*c123_2[1](0,1)-c123_1[2](2,0)*c123_2[0](1,1)-c123_1[0](2,2)*c123_2[1](0,1)+c123_1[0](2,2)*c123_2[1](1,0);
  row(0,81) = c123_1[2](0,2)*c123_2[0](0,1)-c123_1[2](0,2)*c123_2[1](0,0)+c123_1[2](2,0)*c123_2[1](0,0)-c123_1[2](2,0)*c123_2[0](1,0)-c123_1[0](2,2)*c123_2[0](0,1)+c123_1[0](2,2)*c123_2[0](1,0);
  row(0,82) = -c123_1[2](1,1)*c123_2[2](1,2)+c123_1[2](1,1)*c123_2[2](2,1)+c123_1[1](1,2)*c123_2[2](1,2)-c123_1[1](1,2)*c123_2[1](2,2)-c123_1[1](2,1)*c123_2[2](2,1)+c123_1[1](2,1)*c123_2[1](2,2);
  row(0,83) = c123_1[2](1,1)*c123_2[1](1,2)-c123_1[2](1,1)*c123_2[1](2,1)-c123_1[1](1,2)*c123_2[2](1,1)+c123_1[1](1,2)*c123_2[1](2,1)+c123_1[1](2,1)*c123_2[2](1,1)-c123_1[1](2,1)*c123_2[1](1,2);
  row(0,84) = c123_1[2](1,1)*c123_2[2](0,1)+c123_1[2](1,1)*c123_2[1](0,2)-c123_1[2](1,1)*c123_2[2](1,0)-c123_1[2](1,1)*c123_2[1](2,0)-c123_1[1](1,2)*c123_2[2](0,1)-c123_1[1](1,2)*c123_2[1](0,2)+c123_1[1](1,2)*c123_2[0](1,2)+c123_1[1](1,2)*c123_2[0](2,1)+c123_1[1](2,1)*c123_2[2](1,0)-c123_1[1](2,1)*c123_2[0](1,2)+c123_1[1](2,1)*c123_2[1](2,0)-c123_1[1](2,1)*c123_2[0](2,1);
  row(0,85) = -c123_1[2](1,2)*c123_2[2](2,1)+c123_1[2](1,2)*c123_2[1](2,2)+c123_1[2](2,1)*c123_2[2](1,2)-c123_1[2](2,1)*c123_2[1](2,2)-c123_1[1](2,2)*c123_2[2](1,2)+c123_1[1](2,2)*c123_2[2](2,1);
  row(0,86) = c123_1[2](1,2)*c123_2[2](1,1)-c123_1[2](1,2)*c123_2[1](1,2)-c123_1[2](2,1)*c123_2[2](1,1)+c123_1[2](2,1)*c123_2[1](2,1)+c123_1[1](2,2)*c123_2[1](1,2)-c123_1[1](2,2)*c123_2[1](2,1);
  row(0,87) = c123_1[2](1,2)*c123_2[2](1,0)-c123_1[2](1,2)*c123_2[0](1,2)+c123_1[2](1,2)*c123_2[1](2,0)-c123_1[2](1,2)*c123_2[0](2,1)-c123_1[2](2,1)*c123_2[2](0,1)-c123_1[2](2,1)*c123_2[1](0,2)+c123_1[2](2,1)*c123_2[0](1,2)+c123_1[2](2,1)*c123_2[0](2,1)+c123_1[1](2,2)*c123_2[2](0,1)+c123_1[1](2,2)*c123_2[1](0,2)-c123_1[1](2,2)*c123_2[2](1,0)-c123_1[1](2,2)*c123_2[1](2,0);
  row(0,89) = -c123_1[2](1,1)*c123_2[1](1,2)+c123_1[2](1,1)*c123_2[1](2,1)+c123_1[1](1,2)*c123_2[2](1,1)-c123_1[1](1,2)*c123_2[1](2,1)-c123_1[1](2,1)*c123_2[2](1,1)+c123_1[1](2,1)*c123_2[1](1,2);
  row(0,91) = c123_1[2](1,1)*c123_2[1](0,1)-c123_1[2](1,1)*c123_2[1](1,0)-c123_1[1](1,2)*c123_2[1](0,1)+c123_1[1](1,2)*c123_2[0](1,1)+c123_1[1](2,1)*c123_2[1](1,0)-c123_1[1](2,1)*c123_2[0](1,1);
  row(0,92) = -c123_1[2](1,2)*c123_2[2](1,1)+c123_1[2](1,2)*c123_2[1](1,2)+c123_1[2](2,1)*c123_2[2](1,1)-c123_1[2](2,1)*c123_2[1](2,1)-c123_1[1](2,2)*c123_2[1](1,2)+c123_1[1](2,2)*c123_2[1](2,1);
  row(0,94) = c123_1[2](1,2)*c123_2[1](1,0)-c123_1[2](1,2)*c123_2[0](1,1)-c123_1[2](2,1)*c123_2[1](0,1)+c123_1[2](2,1)*c123_2[0](1,1)+c123_1[1](2,2)*c123_2[1](0,1)-c123_1[1](2,2)*c123_2[1](1,0);
  row(0,97) = c123_1[1](0,1)*c123_2[2](2,0)-c123_1[1](0,1)*c123_2[0](2,2)-c123_1[1](1,0)*c123_2[2](0,2)+c123_1[1](1,0)*c123_2[0](2,2)+c123_1[0](1,1)*c123_2[2](0,2)-c123_1[0](1,1)*c123_2[2](2,0);
  row(0,98) = c123_1[1](0,1)*c123_2[2](1,0)-c123_1[1](0,1)*c123_2[0](1,2)+c123_1[1](0,1)*c123_2[1](2,0)-c123_1[1](0,1)*c123_2[0](2,1)-c123_1[1](1,0)*c123_2[2](0,1)-c123_1[1](1,0)*c123_2[1](0,2)+c123_1[1](1,0)*c123_2[0](1,2)+c123_1[1](1,0)*c123_2[0](2,1)+c123_1[0](1,1)*c123_2[2](0,1)+c123_1[0](1,1)*c123_2[1](0,2)-c123_1[0](1,1)*c123_2[2](1,0)-c123_1[0](1,1)*c123_2[1](2,0);
  row(0,99) = c123_1[1](0,1)*c123_2[1](1,0)-c123_1[1](0,1)*c123_2[0](1,1)-c123_1[1](1,0)*c123_2[1](0,1)+c123_1[1](1,0)*c123_2[0](1,1)+c123_1[0](1,1)*c123_2[1](0,1)-c123_1[0](1,1)*c123_2[1](1,0);
  row(0,100) = c123_1[1](0,1)*c123_2[2](0,0)-c123_1[1](0,1)*c123_2[0](0,2)-c123_1[1](1,0)*c123_2[2](0,0)+c123_1[1](1,0)*c123_2[0](2,0)+c123_1[0](1,1)*c123_2[0](0,2)-c123_1[0](1,1)*c123_2[0](2,0);
  row(0,101) = c123_1[1](0,1)*c123_2[1](0,0)-c123_1[1](0,1)*c123_2[0](0,1)-c123_1[1](1,0)*c123_2[1](0,0)+c123_1[1](1,0)*c123_2[0](1,0)+c123_1[0](1,1)*c123_2[0](0,1)-c123_1[0](1,1)*c123_2[0](1,0);
  row(0,103) = -c123_1[2](0,1)*c123_2[2](2,0)+c123_1[2](0,1)*c123_2[0](2,2)-c123_1[1](0,2)*c123_2[2](2,0)+c123_1[1](0,2)*c123_2[0](2,2)+c123_1[2](1,0)*c123_2[2](0,2)-c123_1[2](1,0)*c123_2[0](2,2)-c123_1[0](1,2)*c123_2[2](0,2)+c123_1[0](1,2)*c123_2[2](2,0)+c123_1[1](2,0)*c123_2[2](0,2)-c123_1[1](2,0)*c123_2[0](2,2)-c123_1[0](2,1)*c123_2[2](0,2)+c123_1[0](2,1)*c123_2[2](2,0);
  row(0,104) = -c123_1[2](0,1)*c123_2[2](1,0)+c123_1[2](0,1)*c123_2[0](2,1)+c123_1[1](0,2)*c123_2[0](1,2)-c123_1[1](0,2)*c123_2[1](2,0)+c123_1[2](1,0)*c123_2[2](0,1)-c123_1[2](1,0)*c123_2[0](1,2)-c123_1[0](1,2)*c123_2[1](0,2)+c123_1[0](1,2)*c123_2[2](1,0)+c123_1[1](2,0)*c123_2[1](0,2)-c123_1[1](2,0)*c123_2[0](2,1)-c123_1[0](2,1)*c123_2[2](0,1)+c123_1[0](2,1)*c123_2[1](2,0);
  row(0,105) = -c123_1[2](0,1)*c123_2[2](0,0)+c123_1[2](0,1)*c123_2[0](2,0)+c123_1[1](0,2)*c123_2[0](0,2)-c123_1[1](0,2)*c123_2[0](2,0)+c123_1[2](1,0)*c123_2[2](0,0)-c123_1[2](1,0)*c123_2[0](0,2)+c123_1[0](1,2)*c123_2[2](0,0)-c123_1[0](1,2)*c123_2[0](0,2)+c123_1[1](2,0)*c123_2[0](0,2)-c123_1[1](2,0)*c123_2[0](2,0)-c123_1[0](2,1)*c123_2[2](0,0)+c123_1[0](2,1)*c123_2[0](2,0);
  row(0,106) = c123_1[2](0,2)*c123_2[2](2,0)-c123_1[2](0,2)*c123_2[0](2,2)-c123_1[2](2,0)*c123_2[2](0,2)+c123_1[2](2,0)*c123_2[0](2,2)+c123_1[0](2,2)*c123_2[2](0,2)-c123_1[0](2,2)*c123_2[2](2,0);
  row(0,107) = c123_1[2](0,1)*c123_2[0](1,2)-c123_1[2](0,1)*c123_2[1](2,0)-c123_1[1](0,2)*c123_2[2](1,0)+c123_1[1](0,2)*c123_2[0](2,1)+c123_1[2](1,0)*c123_2[1](0,2)-c123_1[2](1,0)*c123_2[0](2,1)-c123_1[0](1,2)*c123_2[2](0,1)+c123_1[0](1,2)*c123_2[1](2,0)+c123_1[1](2,0)*c123_2[2](0,1)-c123_1[1](2,0)*c123_2[0](1,2)-c123_1[0](2,1)*c123_2[1](0,2)+c123_1[0](2,1)*c123_2[2](1,0);
  row(0,108) = -c123_1[2](0,1)*c123_2[1](1,0)+c123_1[2](0,1)*c123_2[0](1,1)-c123_1[1](0,2)*c123_2[1](1,0)+c123_1[1](0,2)*c123_2[0](1,1)+c123_1[2](1,0)*c123_2[1](0,1)-c123_1[2](1,0)*c123_2[0](1,1)-c123_1[0](1,2)*c123_2[1](0,1)+c123_1[0](1,2)*c123_2[1](1,0)+c123_1[1](2,0)*c123_2[1](0,1)-c123_1[1](2,0)*c123_2[0](1,1)-c123_1[0](2,1)*c123_2[1](0,1)+c123_1[0](2,1)*c123_2[1](1,0);
  row(0,109) = -c123_1[2](0,1)*c123_2[1](0,0)+c123_1[2](0,1)*c123_2[0](1,0)+c123_1[1](0,2)*c123_2[0](0,1)-c123_1[1](0,2)*c123_2[0](1,0)+c123_1[2](1,0)*c123_2[1](0,0)-c123_1[2](1,0)*c123_2[0](0,1)+c123_1[0](1,2)*c123_2[1](0,0)-c123_1[0](1,2)*c123_2[0](0,1)+c123_1[1](2,0)*c123_2[0](0,1)-c123_1[1](2,0)*c123_2[0](1,0)-c123_1[0](2,1)*c123_2[1](0,0)+c123_1[0](2,1)*c123_2[0](1,0);
  row(0,110) = c123_1[2](0,2)*c123_2[2](1,0)-c123_1[2](0,2)*c123_2[0](1,2)+c123_1[2](0,2)*c123_2[1](2,0)-c123_1[2](0,2)*c123_2[0](2,1)-c123_1[2](2,0)*c123_2[2](0,1)-c123_1[2](2,0)*c123_2[1](0,2)+c123_1[2](2,0)*c123_2[0](1,2)+c123_1[2](2,0)*c123_2[0](2,1)+c123_1[0](2,2)*c123_2[2](0,1)+c123_1[0](2,2)*c123_2[1](0,2)-c123_1[0](2,2)*c123_2[2](1,0)-c123_1[0](2,2)*c123_2[1](2,0);
  row(0,111) = c123_1[2](0,2)*c123_2[1](1,0)-c123_1[2](0,2)*c123_2[0](1,1)-c123_1[2](2,0)*c123_2[1](0,1)+c123_1[2](2,0)*c123_2[0](1,1)+c123_1[0](2,2)*c123_2[1](0,1)-c123_1[0](2,2)*c123_2[1](1,0);
  row(0,112) = c123_1[2](0,1)*c123_2[0](0,2)-c123_1[2](0,1)*c123_2[0](2,0)-c123_1[1](0,2)*c123_2[2](0,0)+c123_1[1](0,2)*c123_2[0](2,0)+c123_1[2](1,0)*c123_2[0](0,2)-c123_1[2](1,0)*c123_2[0](2,0)-c123_1[0](1,2)*c123_2[2](0,0)+c123_1[0](1,2)*c123_2[0](2,0)+c123_1[1](2,0)*c123_2[2](0,0)-c123_1[1](2,0)*c123_2[0](0,2)+c123_1[0](2,1)*c123_2[2](0,0)-c123_1[0](2,1)*c123_2[0](0,2);
  row(0,113) = c123_1[2](0,1)*c123_2[0](0,1)-c123_1[2](0,1)*c123_2[0](1,0)-c123_1[1](0,2)*c123_2[1](0,0)+c123_1[1](0,2)*c123_2[0](1,0)+c123_1[2](1,0)*c123_2[0](0,1)-c123_1[2](1,0)*c123_2[0](1,0)-c123_1[0](1,2)*c123_2[1](0,0)+c123_1[0](1,2)*c123_2[0](1,0)+c123_1[1](2,0)*c123_2[1](0,0)-c123_1[1](2,0)*c123_2[0](0,1)+c123_1[0](2,1)*c123_2[1](0,0)-c123_1[0](2,1)*c123_2[0](0,1);
  row(0,115) = c123_1[2](0,2)*c123_2[2](0,0)-c123_1[2](0,2)*c123_2[0](0,2)-c123_1[2](2,0)*c123_2[2](0,0)+c123_1[2](2,0)*c123_2[0](2,0)+c123_1[0](2,2)*c123_2[0](0,2)-c123_1[0](2,2)*c123_2[0](2,0);
  row(0,116) = c123_1[2](0,2)*c123_2[1](0,0)-c123_1[2](0,2)*c123_2[0](0,1)-c123_1[2](2,0)*c123_2[1](0,0)+c123_1[2](2,0)*c123_2[0](1,0)+c123_1[0](2,2)*c123_2[0](0,1)-c123_1[0](2,2)*c123_2[0](1,0);
  row(0,118) = -c123_1[2](1,1)*c123_2[2](0,2)+c123_1[2](1,1)*c123_2[2](2,0)+c123_1[1](1,2)*c123_2[2](0,2)-c123_1[1](1,2)*c123_2[0](2,2)-c123_1[1](2,1)*c123_2[2](2,0)+c123_1[1](2,1)*c123_2[0](2,2);
  row(0,119) = -c123_1[2](1,1)*c123_2[2](0,1)+c123_1[2](1,1)*c123_2[2](1,0)+c123_1[2](1,1)*c123_2[0](1,2)-c123_1[2](1,1)*c123_2[0](2,1)+c123_1[1](1,2)*c123_2[1](0,2)-c123_1[1](1,2)*c123_2[2](1,0)-c123_1[1](1,2)*c123_2[0](1,2)+c123_1[1](1,2)*c123_2[1](2,0)+c123_1[1](2,1)*c123_2[2](0,1)-c123_1[1](2,1)*c123_2[1](0,2)-c123_1[1](2,1)*c123_2[1](2,0)+c123_1[1](2,1)*c123_2[0](2,1);
  row(0,120) = c123_1[2](1,1)*c123_2[0](0,2)-c123_1[2](1,1)*c123_2[0](2,0)-c123_1[1](1,2)*c123_2[2](0,0)+c123_1[1](1,2)*c123_2[0](2,0)+c123_1[1](2,1)*c123_2[2](0,0)-c123_1[1](2,1)*c123_2[0](0,2);
  row(0,121) = -c123_1[2](1,2)*c123_2[2](2,0)+c123_1[2](1,2)*c123_2[0](2,2)+c123_1[2](2,1)*c123_2[2](0,2)-c123_1[2](2,1)*c123_2[0](2,2)-c123_1[1](2,2)*c123_2[2](0,2)+c123_1[1](2,2)*c123_2[2](2,0);
  row(0,122) = c123_1[2](1,2)*c123_2[2](0,1)-c123_1[2](1,2)*c123_2[1](0,2)-c123_1[2](1,2)*c123_2[1](2,0)+c123_1[2](1,2)*c123_2[0](2,1)+c123_1[2](2,1)*c123_2[1](0,2)-c123_1[2](2,1)*c123_2[2](1,0)-c123_1[2](2,1)*c123_2[0](1,2)+c123_1[2](2,1)*c123_2[1](2,0)-c123_1[1](2,2)*c123_2[2](0,1)+c123_1[1](2,2)*c123_2[2](1,0)+c123_1[1](2,2)*c123_2[0](1,2)-c123_1[1](2,2)*c123_2[0](2,1);
  row(0,123) = c123_1[2](1,2)*c123_2[2](0,0)-c123_1[2](1,2)*c123_2[0](0,2)-c123_1[2](2,1)*c123_2[2](0,0)+c123_1[2](2,1)*c123_2[0](2,0)+c123_1[1](2,2)*c123_2[0](0,2)-c123_1[1](2,2)*c123_2[0](2,0);
  row(0,125) = -c123_1[2](1,1)*c123_2[1](0,2)-c123_1[2](1,1)*c123_2[0](1,2)+c123_1[2](1,1)*c123_2[1](2,0)+c123_1[2](1,1)*c123_2[0](2,1)+c123_1[1](1,2)*c123_2[2](0,1)+c123_1[1](1,2)*c123_2[2](1,0)-c123_1[1](1,2)*c123_2[1](2,0)-c123_1[1](1,2)*c123_2[0](2,1)-c123_1[1](2,1)*c123_2[2](0,1)+c123_1[1](2,1)*c123_2[1](0,2)-c123_1[1](2,1)*c123_2[2](1,0)+c123_1[1](2,1)*c123_2[0](1,2);
  row(0,126) = -c123_1[2](1,1)*c123_2[1](0,1)+c123_1[2](1,1)*c123_2[1](1,0)+c123_1[1](1,2)*c123_2[1](0,1)-c123_1[1](1,2)*c123_2[0](1,1)-c123_1[1](2,1)*c123_2[1](1,0)+c123_1[1](2,1)*c123_2[0](1,1);
  row(0,127) = c123_1[2](1,1)*c123_2[0](0,1)-c123_1[2](1,1)*c123_2[0](1,0)-c123_1[1](1,2)*c123_2[1](0,0)+c123_1[1](1,2)*c123_2[0](1,0)+c123_1[1](2,1)*c123_2[1](0,0)-c123_1[1](2,1)*c123_2[0](0,1);
  row(0,128) = -c123_1[2](1,2)*c123_2[2](0,1)+c123_1[2](1,2)*c123_2[1](0,2)-c123_1[2](1,2)*c123_2[2](1,0)+c123_1[2](1,2)*c123_2[0](1,2)+c123_1[2](2,1)*c123_2[2](0,1)+c123_1[2](2,1)*c123_2[2](1,0)-c123_1[2](2,1)*c123_2[1](2,0)-c123_1[2](2,1)*c123_2[0](2,1)-c123_1[1](2,2)*c123_2[1](0,2)-c123_1[1](2,2)*c123_2[0](1,2)+c123_1[1](2,2)*c123_2[1](2,0)+c123_1[1](2,2)*c123_2[0](2,1);
  row(0,129) = -c123_1[2](1,2)*c123_2[1](1,0)+c123_1[2](1,2)*c123_2[0](1,1)+c123_1[2](2,1)*c123_2[1](0,1)-c123_1[2](2,1)*c123_2[0](1,1)-c123_1[1](2,2)*c123_2[1](0,1)+c123_1[1](2,2)*c123_2[1](1,0);
  row(0,130) = c123_1[2](1,2)*c123_2[1](0,0)-c123_1[2](1,2)*c123_2[0](0,1)-c123_1[2](2,1)*c123_2[1](0,0)+c123_1[2](2,1)*c123_2[0](1,0)+c123_1[1](2,2)*c123_2[0](0,1)-c123_1[1](2,2)*c123_2[0](1,0);
  row(0,133) = -c123_1[2](1,1)*c123_2[0](0,2)+c123_1[2](1,1)*c123_2[0](2,0)+c123_1[1](1,2)*c123_2[2](0,0)-c123_1[1](1,2)*c123_2[0](2,0)-c123_1[1](2,1)*c123_2[2](0,0)+c123_1[1](2,1)*c123_2[0](0,2);
  row(0,134) = -c123_1[2](1,1)*c123_2[0](0,1)+c123_1[2](1,1)*c123_2[0](1,0)+c123_1[1](1,2)*c123_2[1](0,0)-c123_1[1](1,2)*c123_2[0](1,0)-c123_1[1](2,1)*c123_2[1](0,0)+c123_1[1](2,1)*c123_2[0](0,1);
  row(0,136) = -c123_1[2](1,2)*c123_2[2](0,0)+c123_1[2](1,2)*c123_2[0](0,2)+c123_1[2](2,1)*c123_2[2](0,0)-c123_1[2](2,1)*c123_2[0](2,0)-c123_1[1](2,2)*c123_2[0](0,2)+c123_1[1](2,2)*c123_2[0](2,0);
  row(0,137) = -c123_1[2](1,2)*c123_2[1](0,0)+c123_1[2](1,2)*c123_2[0](0,1)+c123_1[2](2,1)*c123_2[1](0,0)-c123_1[2](2,1)*c123_2[0](1,0)-c123_1[1](2,2)*c123_2[0](0,1)+c123_1[1](2,2)*c123_2[0](1,0);
  return row;
}